

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  ulong uVar70;
  RayK<16> *pRVar71;
  byte bVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  bool bVar76;
  uint uVar77;
  Geometry *geometry;
  long lVar78;
  ulong uVar79;
  float fVar80;
  float fVar81;
  float fVar128;
  float fVar130;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar134;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined4 uVar135;
  undefined8 uVar136;
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar148;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar162;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  float fVar173;
  float fVar174;
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vint4 ai_1;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 ai;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_9f9;
  RTCFilterFunctionNArguments local_9c0;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  LinearSpace3fa *local_8b0;
  Primitive *local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined8 local_720;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  int local_67c;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  byte local_630;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  lVar24 = uVar70 * 0x25;
  fVar164 = *(float *)(prim + lVar24 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar86 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar159._0_4_ = fVar164 * auVar86._0_4_;
  auVar159._4_4_ = fVar164 * auVar86._4_4_;
  auVar159._8_4_ = fVar164 * auVar86._8_4_;
  auVar159._12_4_ = fVar164 * auVar86._12_4_;
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar137._0_4_ = fVar164 * auVar85._0_4_;
  auVar137._4_4_ = fVar164 * auVar85._4_4_;
  auVar137._8_4_ = fVar164 * auVar85._8_4_;
  auVar137._12_4_ = fVar164 * auVar85._12_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar206 = vcvtdq2ps_avx(auVar206);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar70 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar176._4_4_ = auVar137._0_4_;
  auVar176._0_4_ = auVar137._0_4_;
  auVar176._8_4_ = auVar137._0_4_;
  auVar176._12_4_ = auVar137._0_4_;
  auVar88 = vshufps_avx(auVar137,auVar137,0x55);
  auVar89 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar164 = auVar89._0_4_;
  auVar153._0_4_ = fVar164 * auVar87._0_4_;
  fVar148 = auVar89._4_4_;
  auVar153._4_4_ = fVar148 * auVar87._4_4_;
  fVar163 = auVar89._8_4_;
  auVar153._8_4_ = fVar163 * auVar87._8_4_;
  fVar173 = auVar89._12_4_;
  auVar153._12_4_ = fVar173 * auVar87._12_4_;
  auVar149._0_4_ = auVar19._0_4_ * fVar164;
  auVar149._4_4_ = auVar19._4_4_ * fVar148;
  auVar149._8_4_ = auVar19._8_4_ * fVar163;
  auVar149._12_4_ = auVar19._12_4_ * fVar173;
  auVar138._0_4_ = auVar22._0_4_ * fVar164;
  auVar138._4_4_ = auVar22._4_4_ * fVar148;
  auVar138._8_4_ = auVar22._8_4_ * fVar163;
  auVar138._12_4_ = auVar22._12_4_ * fVar173;
  auVar89 = vfmadd231ps_fma(auVar153,auVar88,auVar85);
  auVar26 = vfmadd231ps_fma(auVar149,auVar88,auVar18);
  auVar88 = vfmadd231ps_fma(auVar138,auVar21,auVar88);
  auVar90 = vfmadd231ps_fma(auVar89,auVar176,auVar86);
  auVar26 = vfmadd231ps_fma(auVar26,auVar176,auVar206);
  auVar27 = vfmadd231ps_fma(auVar88,auVar20,auVar176);
  auVar196._4_4_ = auVar159._0_4_;
  auVar196._0_4_ = auVar159._0_4_;
  auVar196._8_4_ = auVar159._0_4_;
  auVar196._12_4_ = auVar159._0_4_;
  auVar88 = vshufps_avx(auVar159,auVar159,0x55);
  auVar89 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar164 = auVar89._0_4_;
  auVar177._0_4_ = fVar164 * auVar87._0_4_;
  fVar148 = auVar89._4_4_;
  auVar177._4_4_ = fVar148 * auVar87._4_4_;
  fVar163 = auVar89._8_4_;
  auVar177._8_4_ = fVar163 * auVar87._8_4_;
  fVar173 = auVar89._12_4_;
  auVar177._12_4_ = fVar173 * auVar87._12_4_;
  auVar165._0_4_ = auVar19._0_4_ * fVar164;
  auVar165._4_4_ = auVar19._4_4_ * fVar148;
  auVar165._8_4_ = auVar19._8_4_ * fVar163;
  auVar165._12_4_ = auVar19._12_4_ * fVar173;
  auVar160._0_4_ = auVar22._0_4_ * fVar164;
  auVar160._4_4_ = auVar22._4_4_ * fVar148;
  auVar160._8_4_ = auVar22._8_4_ * fVar163;
  auVar160._12_4_ = auVar22._12_4_ * fVar173;
  auVar85 = vfmadd231ps_fma(auVar177,auVar88,auVar85);
  auVar87 = vfmadd231ps_fma(auVar165,auVar88,auVar18);
  auVar18 = vfmadd231ps_fma(auVar160,auVar88,auVar21);
  auVar28 = vfmadd231ps_fma(auVar85,auVar196,auVar86);
  auVar137 = vfmadd231ps_fma(auVar87,auVar196,auVar206);
  auVar188._8_4_ = 0x7fffffff;
  auVar188._0_8_ = 0x7fffffff7fffffff;
  auVar188._12_4_ = 0x7fffffff;
  auVar138 = vfmadd231ps_fma(auVar18,auVar196,auVar20);
  auVar86 = vandps_avx(auVar188,auVar90);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar86,auVar185,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar82._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar90._12_4_;
  auVar86 = vandps_avx(auVar188,auVar26);
  uVar79 = vcmpps_avx512vl(auVar86,auVar185,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar83._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar26._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar26._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar26._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar26._12_4_;
  auVar86 = vandps_avx(auVar188,auVar27);
  uVar79 = vcmpps_avx512vl(auVar86,auVar185,1);
  bVar76 = (bool)((byte)uVar79 & 1);
  auVar84._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._0_4_;
  bVar76 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._4_4_;
  bVar76 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._8_4_;
  bVar76 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar27._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = &DAT_3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar82,auVar85,auVar186);
  auVar90 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar86 = vfnmadd213ps_fma(auVar83,auVar85,auVar186);
  auVar27 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar86 = vfnmadd213ps_fma(auVar84,auVar85,auVar186);
  auVar25 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  fVar164 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar183._4_4_ = fVar164;
  auVar183._0_4_ = fVar164;
  auVar183._8_4_ = fVar164;
  auVar183._12_4_ = fVar164;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar206 = vsubps_avx(auVar85,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar85 = vpmovsxwd_avx(auVar87);
  auVar87 = vfmadd213ps_fma(auVar206,auVar183,auVar86);
  auVar86 = vcvtdq2ps_avx(auVar85);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar85 = vpmovsxwd_avx(auVar206);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar206 = vfmadd213ps_fma(auVar85,auVar183,auVar86);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar86 = vpmovsxwd_avx(auVar18);
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar79 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar79 + 6);
  auVar85 = vpmovsxwd_avx(auVar19);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar18 = vfmadd213ps_fma(auVar85,auVar183,auVar86);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar86 = vpmovsxwd_avx(auVar20);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar21);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar19 = vfmadd213ps_fma(auVar85,auVar183,auVar86);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar86 = vpmovsxwd_avx(auVar22);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar85 = vpmovsxwd_avx(auVar88);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar20 = vfmadd213ps_fma(auVar85,auVar183,auVar86);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar70) + 6);
  auVar86 = vpmovsxwd_avx(auVar89);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar26);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar85 = vfmadd213ps_fma(auVar85,auVar183,auVar86);
  auVar86 = vsubps_avx(auVar87,auVar28);
  auVar184._0_4_ = auVar90._0_4_ * auVar86._0_4_;
  auVar184._4_4_ = auVar90._4_4_ * auVar86._4_4_;
  auVar184._8_4_ = auVar90._8_4_ * auVar86._8_4_;
  auVar184._12_4_ = auVar90._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar206,auVar28);
  auVar154._0_4_ = auVar90._0_4_ * auVar86._0_4_;
  auVar154._4_4_ = auVar90._4_4_ * auVar86._4_4_;
  auVar154._8_4_ = auVar90._8_4_ * auVar86._8_4_;
  auVar154._12_4_ = auVar90._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar18,auVar137);
  auVar178._0_4_ = auVar27._0_4_ * auVar86._0_4_;
  auVar178._4_4_ = auVar27._4_4_ * auVar86._4_4_;
  auVar178._8_4_ = auVar27._8_4_ * auVar86._8_4_;
  auVar178._12_4_ = auVar27._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar19,auVar137);
  auVar150._0_4_ = auVar27._0_4_ * auVar86._0_4_;
  auVar150._4_4_ = auVar27._4_4_ * auVar86._4_4_;
  auVar150._8_4_ = auVar27._8_4_ * auVar86._8_4_;
  auVar150._12_4_ = auVar27._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar20,auVar138);
  auVar166._0_4_ = auVar25._0_4_ * auVar86._0_4_;
  auVar166._4_4_ = auVar25._4_4_ * auVar86._4_4_;
  auVar166._8_4_ = auVar25._8_4_ * auVar86._8_4_;
  auVar166._12_4_ = auVar25._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar85,auVar138);
  auVar139._0_4_ = auVar25._0_4_ * auVar86._0_4_;
  auVar139._4_4_ = auVar25._4_4_ * auVar86._4_4_;
  auVar139._8_4_ = auVar25._8_4_ * auVar86._8_4_;
  auVar139._12_4_ = auVar25._12_4_ * auVar86._12_4_;
  auVar86 = vpminsd_avx(auVar184,auVar154);
  auVar85 = vpminsd_avx(auVar178,auVar150);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar85 = vpminsd_avx(auVar166,auVar139);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar90._4_4_ = uVar135;
  auVar90._0_4_ = uVar135;
  auVar90._8_4_ = uVar135;
  auVar90._12_4_ = uVar135;
  auVar85 = vmaxps_avx512vl(auVar85,auVar90);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar27._8_4_ = 0x3f7ffffa;
  auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar27._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar86,auVar27);
  auVar86 = vpmaxsd_avx(auVar184,auVar154);
  auVar85 = vpmaxsd_avx(auVar178,auVar150);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar85 = vpmaxsd_avx(auVar166,auVar139);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar25._4_4_ = uVar135;
  auVar25._0_4_ = uVar135;
  auVar25._8_4_ = uVar135;
  auVar25._12_4_ = uVar135;
  auVar85 = vminps_avx512vl(auVar85,auVar25);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar28);
  auVar85 = vpbroadcastd_avx512vl();
  uVar136 = vcmpps_avx512vl(local_510,auVar86,2);
  uVar79 = vpcmpgtd_avx512vl(auVar85,_DAT_01ff0cf0);
  uVar79 = ((byte)uVar136 & 0xf) & uVar79;
  local_9f9 = (char)uVar79 != '\0';
  if (local_9f9) {
    local_8b0 = pre->ray_space + k;
    auVar147 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar147);
    local_8a8 = prim;
    do {
      lVar24 = 0;
      for (uVar70 = uVar79; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar77 = *(uint *)(local_8a8 + 2);
      pGVar8 = (context->scene->geometries).items[uVar77].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_8a8 + lVar24 * 4 + 6));
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,*(uint *)(local_8a8 + lVar24 * 4 + 6)) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar164 = (pGVar8->time_range).lower;
      fVar164 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar164) /
                ((pGVar8->time_range).upper - fVar164));
      auVar86 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
      auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
      auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
      fVar164 = fVar164 - auVar86._0_4_;
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar86._0_4_ * 0x38;
      lVar24 = *(long *)(_Var9 + 0x10 + lVar74);
      lVar78 = *(long *)(_Var9 + 0x38 + lVar74);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar74);
      auVar151._4_4_ = fVar164;
      auVar151._0_4_ = fVar164;
      auVar151._8_4_ = fVar164;
      auVar151._12_4_ = fVar164;
      pfVar3 = (float *)(lVar78 + uVar70 * lVar10);
      auVar189._0_4_ = fVar164 * *pfVar3;
      auVar189._4_4_ = fVar164 * pfVar3[1];
      auVar189._8_4_ = fVar164 * pfVar3[2];
      auVar189._12_4_ = fVar164 * pfVar3[3];
      pfVar3 = (float *)(lVar78 + (uVar70 + 1) * lVar10);
      auVar190._0_4_ = fVar164 * *pfVar3;
      auVar190._4_4_ = fVar164 * pfVar3[1];
      auVar190._8_4_ = fVar164 * pfVar3[2];
      auVar190._12_4_ = fVar164 * pfVar3[3];
      auVar86 = vmulps_avx512vl(auVar151,*(undefined1 (*) [16])(lVar78 + (uVar70 + 2) * lVar10));
      auVar85 = vmulps_avx512vl(auVar151,*(undefined1 (*) [16])(lVar78 + lVar10 * (uVar70 + 3)));
      lVar78 = *(long *)(_Var9 + lVar74);
      fVar164 = 1.0 - fVar164;
      auVar140._4_4_ = fVar164;
      auVar140._0_4_ = fVar164;
      auVar140._8_4_ = fVar164;
      auVar140._12_4_ = fVar164;
      local_970 = vfmadd231ps_fma(auVar189,auVar140,*(undefined1 (*) [16])(lVar78 + lVar24 * uVar70)
                                 );
      local_750 = vfmadd231ps_fma(auVar190,auVar140,
                                  *(undefined1 (*) [16])(lVar78 + lVar24 * (uVar70 + 1)));
      local_760 = vfmadd231ps_avx512vl
                            (auVar86,auVar140,*(undefined1 (*) [16])(lVar78 + lVar24 * (uVar70 + 2))
                            );
      local_770 = vfmadd231ps_avx512vl
                            (auVar85,auVar140,*(undefined1 (*) [16])(lVar78 + lVar24 * (uVar70 + 3))
                            );
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar24 = (long)iVar7 * 0x44;
      auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar87 = vsubps_avx(local_970,auVar86);
      uVar135 = auVar87._0_4_;
      auVar155._4_4_ = uVar135;
      auVar155._0_4_ = uVar135;
      auVar155._8_4_ = uVar135;
      auVar155._12_4_ = uVar135;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      aVar4 = (local_8b0->vx).field_0;
      aVar5 = (local_8b0->vy).field_0;
      fVar164 = (local_8b0->vz).field_0.m128[0];
      fVar148 = *(float *)((long)&(local_8b0->vz).field_0 + 4);
      fVar163 = *(float *)((long)&(local_8b0->vz).field_0 + 8);
      fVar173 = *(float *)((long)&(local_8b0->vz).field_0 + 0xc);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar192._0_4_ = fVar164 * auVar87._0_4_;
      auVar192._4_4_ = fVar148 * auVar87._4_4_;
      auVar192._8_4_ = fVar163 * auVar87._8_4_;
      auVar192._12_4_ = fVar173 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar85);
      auVar206 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar155);
      auVar87 = vsubps_avx(local_750,auVar86);
      uVar135 = auVar87._0_4_;
      auVar156._4_4_ = uVar135;
      auVar156._0_4_ = uVar135;
      auVar156._8_4_ = uVar135;
      auVar156._12_4_ = uVar135;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar193._0_4_ = fVar164 * auVar87._0_4_;
      auVar193._4_4_ = fVar148 * auVar87._4_4_;
      auVar193._8_4_ = fVar163 * auVar87._8_4_;
      auVar193._12_4_ = fVar173 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar5,auVar85);
      auVar18 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar156);
      auVar87 = vsubps_avx512vl(local_760,auVar86);
      uVar135 = auVar87._0_4_;
      auVar157._4_4_ = uVar135;
      auVar157._0_4_ = uVar135;
      auVar157._8_4_ = uVar135;
      auVar157._12_4_ = uVar135;
      auVar85 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar194._0_4_ = fVar164 * auVar87._0_4_;
      auVar194._4_4_ = fVar148 * auVar87._4_4_;
      auVar194._8_4_ = fVar163 * auVar87._8_4_;
      auVar194._12_4_ = fVar173 * auVar87._12_4_;
      auVar85 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar85);
      auVar87 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar157);
      auVar85 = vsubps_avx512vl(local_770,auVar86);
      uVar135 = auVar85._0_4_;
      auVar152._4_4_ = uVar135;
      auVar152._0_4_ = uVar135;
      auVar152._8_4_ = uVar135;
      auVar152._12_4_ = uVar135;
      auVar86 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar198._0_4_ = fVar164 * auVar85._0_4_;
      auVar198._4_4_ = fVar148 * auVar85._4_4_;
      auVar198._8_4_ = fVar163 * auVar85._8_4_;
      auVar198._12_4_ = fVar173 * auVar85._12_4_;
      auVar86 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar86);
      auVar19 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar152);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar135 = auVar206._0_4_;
      local_7a0._4_4_ = uVar135;
      local_7a0._0_4_ = uVar135;
      local_7a0._8_4_ = uVar135;
      local_7a0._12_4_ = uVar135;
      local_7a0._16_4_ = uVar135;
      local_7a0._20_4_ = uVar135;
      local_7a0._24_4_ = uVar135;
      local_7a0._28_4_ = uVar135;
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      auVar91._8_4_ = 1;
      auVar91._0_8_ = 0x100000001;
      auVar91._12_4_ = 1;
      auVar91._16_4_ = 1;
      auVar91._20_4_ = 1;
      auVar91._24_4_ = 1;
      auVar91._28_4_ = 1;
      local_740 = vpermps_avx2(auVar91,ZEXT1632(auVar206));
      local_7c0 = vbroadcastss_avx512vl(auVar18);
      local_900 = vpermps_avx512vl(auVar91,ZEXT1632(auVar18));
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      local_920 = vbroadcastss_avx512vl(auVar87);
      local_800 = vpermps_avx512vl(auVar91,ZEXT1632(auVar87));
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0xd8c);
      local_820 = vbroadcastss_avx512vl(auVar19);
      auVar147 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar91,ZEXT1632(auVar19));
      auVar209 = ZEXT3264(local_840);
      auVar91 = vmulps_avx512vl(local_820,auVar103);
      auVar92 = vmulps_avx512vl(local_840,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_920);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_800);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_7c0);
      auVar93 = vfmadd231ps_avx512vl(auVar92,auVar108,local_900);
      auVar94 = vfmadd231ps_avx512vl(auVar91,auVar106,local_7a0);
      auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar106,local_740);
      auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0xd8c);
      auVar96 = vmulps_avx512vl(local_820,auVar93);
      auVar97 = vmulps_avx512vl(local_840,auVar93);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_920);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_800);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_7c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_900);
      auVar20 = vfmadd231ps_fma(auVar96,auVar91,local_7a0);
      auVar21 = vfmadd231ps_fma(auVar97,auVar91,local_740);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar20),auVar94);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar21),auVar95);
      auVar96 = vmulps_avx512vl(auVar95,auVar97);
      auVar99 = vmulps_avx512vl(auVar94,auVar98);
      auVar96 = vsubps_avx512vl(auVar96,auVar99);
      auVar86 = vshufps_avx(local_970,local_970,0xff);
      uVar136 = auVar86._0_8_;
      local_320._8_8_ = uVar136;
      local_320._0_8_ = uVar136;
      local_320._16_8_ = uVar136;
      local_320._24_8_ = uVar136;
      auVar86 = vshufps_avx(local_750,local_750,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(local_760,local_760,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(local_770,local_770,0xff);
      uVar136 = auVar86._0_8_;
      register0x00001248 = uVar136;
      local_380 = uVar136;
      register0x00001250 = uVar136;
      register0x00001258 = uVar136;
      auVar99 = vmulps_avx512vl(_local_380,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_360);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_320);
      auVar100 = vmulps_avx512vl(_local_380,auVar93);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_360);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_340);
      auVar22 = vfmadd231ps_fma(auVar100,auVar91,local_320);
      auVar100 = vmulps_avx512vl(auVar98,auVar98);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar97);
      auVar101 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar22));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar100 = vmulps_avx512vl(auVar101,auVar100);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar136 = vcmpps_avx512vl(auVar96,auVar100,2);
      auVar86 = vblendps_avx(auVar206,local_970,8);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar85 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vblendps_avx(auVar18,local_750,8);
      auVar86 = vandps_avx512vl(auVar86,auVar88);
      auVar85 = vmaxps_avx(auVar85,auVar86);
      auVar86 = vblendps_avx(auVar87,local_760,8);
      auVar89 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vblendps_avx(auVar19,local_770,8);
      auVar86 = vandps_avx512vl(auVar86,auVar88);
      auVar86 = vmaxps_avx(auVar89,auVar86);
      auVar86 = vmaxps_avx(auVar85,auVar86);
      auVar85 = vmovshdup_avx(auVar86);
      auVar85 = vmaxss_avx(auVar85,auVar86);
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      auVar86 = vmaxss_avx(auVar86,auVar85);
      auVar85 = vcvtsi2ss_avx512f(local_760,iVar7);
      local_480._0_16_ = auVar85;
      auVar100._0_4_ = auVar85._0_4_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      uVar23 = vcmpps_avx512vl(auVar100,_DAT_02020f40,0xe);
      local_630 = (byte)uVar136 & (byte)uVar23;
      fVar148 = auVar86._0_4_ * 4.7683716e-07;
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar206));
      local_3c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar18));
      local_3e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar87));
      auVar96 = vpermps_avx2(auVar96,ZEXT1632(auVar19));
      fVar164 = *(float *)(ray + k * 4 + 0xc0);
      auVar86 = auVar98._0_16_;
      _local_990 = ZEXT416((uint)fVar148);
      if (local_630 == 0) {
        bVar76 = false;
        auVar86 = vxorps_avx512vl(auVar86,auVar86);
        auVar207 = ZEXT1664(auVar86);
        auVar203 = ZEXT3264(local_7a0);
        auVar204 = ZEXT3264(local_740);
        auVar205 = ZEXT3264(local_7c0);
        auVar202 = ZEXT3264(local_900);
        auVar210 = ZEXT3264(local_920);
        auVar208 = ZEXT3264(local_800);
      }
      else {
        fStack_85c = 0.0;
        fStack_858 = 0.0;
        fStack_854 = 0.0;
        auVar93 = vmulps_avx512vl(auVar96,auVar93);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_3e0,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar102);
        auVar101 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar92);
        auVar103 = vmulps_avx512vl(auVar96,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar108,local_3c0,auVar104);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar106,local_3a0,auVar92);
        auVar106 = vmulps_avx512vl(local_820,auVar91);
        auVar92 = vmulps_avx512vl(local_840,auVar91);
        auVar195._0_4_ = auVar96._0_4_ * auVar91._0_4_;
        auVar195._4_4_ = auVar96._4_4_ * auVar91._4_4_;
        auVar195._8_4_ = auVar96._8_4_ * auVar91._8_4_;
        auVar195._12_4_ = auVar96._12_4_ * auVar91._12_4_;
        auVar195._16_4_ = auVar96._16_4_ * auVar91._16_4_;
        auVar195._20_4_ = auVar96._20_4_ * auVar91._20_4_;
        auVar195._24_4_ = auVar96._24_4_ * auVar91._24_4_;
        auVar195._28_4_ = 0;
        auVar210 = ZEXT3264(local_920);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_920);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar103,local_800);
        auVar103 = vfmadd231ps_avx512vl(auVar195,local_3e0,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_7c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_900);
        auVar92 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar104);
        auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,local_7a0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_740);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_3a0,auVar108);
        auVar93 = vmulps_avx512vl(local_820,auVar103);
        auVar107 = vmulps_avx512vl(local_840,auVar103);
        auVar108._4_4_ = auVar96._4_4_ * auVar103._4_4_;
        auVar108._0_4_ = auVar96._0_4_ * auVar103._0_4_;
        auVar108._8_4_ = auVar96._8_4_ * auVar103._8_4_;
        auVar108._12_4_ = auVar96._12_4_ * auVar103._12_4_;
        auVar108._16_4_ = auVar96._16_4_ * auVar103._16_4_;
        auVar108._20_4_ = auVar96._20_4_ * auVar103._20_4_;
        auVar108._24_4_ = auVar96._24_4_ * auVar103._24_4_;
        auVar108._28_4_ = auVar103._28_4_;
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar104,local_920);
        auVar93 = vfmadd231ps_avx512vl(auVar107,auVar104,local_800);
        auVar104 = vfmadd231ps_avx512vl(auVar108,local_3e0,auVar104);
        auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_7c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_900);
        auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar103,auVar106,local_7a0);
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar106,local_740);
        auVar93 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
        auVar199._8_4_ = 0x7fffffff;
        auVar199._0_8_ = 0x7fffffff7fffffff;
        auVar199._12_4_ = 0x7fffffff;
        auVar199._16_4_ = 0x7fffffff;
        auVar199._20_4_ = 0x7fffffff;
        auVar199._24_4_ = 0x7fffffff;
        auVar199._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar102,auVar199);
        auVar108 = vandps_avx(auVar91,auVar199);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar92,auVar199);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        auVar92 = vbroadcastss_avx512vl(_local_990);
        uVar70 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar76 = (bool)((byte)uVar70 & 1);
        auVar107._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar102._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar102._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar102._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar102._12_4_);
        bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar102._16_4_);
        bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar102._20_4_);
        bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar102._24_4_);
        bVar76 = SUB81(uVar70 >> 7,0);
        auVar107._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar102._28_4_;
        bVar76 = (bool)((byte)uVar70 & 1);
        auVar109._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar91._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar70 >> 7,0);
        auVar109._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar106 = vandps_avx(auVar199,auVar104);
        auVar108 = vandps_avx(auVar103,auVar199);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar93,auVar199);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        uVar70 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar76 = (bool)((byte)uVar70 & 1);
        auVar110._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar104._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar104._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar104._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar104._12_4_);
        bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar104._16_4_);
        bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar104._20_4_);
        bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar104._24_4_);
        bVar76 = SUB81(uVar70 >> 7,0);
        auVar110._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar104._28_4_;
        bVar76 = (bool)((byte)uVar70 & 1);
        auVar111._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar103._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar103._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar103._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar103._12_4_);
        bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar103._16_4_);
        bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar103._20_4_);
        bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar103._24_4_);
        bVar76 = SUB81(uVar70 >> 7,0);
        auVar111._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar103._28_4_;
        auVar90 = vxorps_avx512vl(auVar86,auVar86);
        auVar207 = ZEXT1664(auVar90);
        auVar106 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar90));
        auVar86 = vfmadd231ps_fma(auVar106,auVar109,auVar109);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar108._0_4_;
        fVar173 = auVar108._4_4_;
        fVar174 = auVar108._8_4_;
        fVar175 = auVar108._12_4_;
        fVar158 = auVar108._16_4_;
        fVar162 = auVar108._20_4_;
        fVar80 = auVar108._24_4_;
        auVar106._4_4_ = fVar173 * fVar173 * fVar173 * auVar86._4_4_ * -0.5;
        auVar106._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar106._8_4_ = fVar174 * fVar174 * fVar174 * auVar86._8_4_ * -0.5;
        auVar106._12_4_ = fVar175 * fVar175 * fVar175 * auVar86._12_4_ * -0.5;
        auVar106._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar106._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar106._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar106._28_4_ = auVar93._28_4_;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar91,auVar108);
        auVar104._4_4_ = auVar109._4_4_ * auVar106._4_4_;
        auVar104._0_4_ = auVar109._0_4_ * auVar106._0_4_;
        auVar104._8_4_ = auVar109._8_4_ * auVar106._8_4_;
        auVar104._12_4_ = auVar109._12_4_ * auVar106._12_4_;
        auVar104._16_4_ = auVar109._16_4_ * auVar106._16_4_;
        auVar104._20_4_ = auVar109._20_4_ * auVar106._20_4_;
        auVar104._24_4_ = auVar109._24_4_ * auVar106._24_4_;
        auVar104._28_4_ = 0;
        auVar103._4_4_ = auVar106._4_4_ * -auVar107._4_4_;
        auVar103._0_4_ = auVar106._0_4_ * -auVar107._0_4_;
        auVar103._8_4_ = auVar106._8_4_ * -auVar107._8_4_;
        auVar103._12_4_ = auVar106._12_4_ * -auVar107._12_4_;
        auVar103._16_4_ = auVar106._16_4_ * -auVar107._16_4_;
        auVar103._20_4_ = auVar106._20_4_ * -auVar107._20_4_;
        auVar103._24_4_ = auVar106._24_4_ * -auVar107._24_4_;
        auVar103._28_4_ = auVar109._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar90));
        auVar97 = ZEXT1632(auVar90);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar97);
        auVar86 = vfmadd231ps_fma(auVar108,auVar111,auVar111);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar108._0_4_;
        fVar173 = auVar108._4_4_;
        fVar174 = auVar108._8_4_;
        fVar175 = auVar108._12_4_;
        fVar158 = auVar108._16_4_;
        fVar162 = auVar108._20_4_;
        fVar80 = auVar108._24_4_;
        auVar92._4_4_ = fVar173 * fVar173 * fVar173 * auVar86._4_4_ * -0.5;
        auVar92._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar92._8_4_ = fVar174 * fVar174 * fVar174 * auVar86._8_4_ * -0.5;
        auVar92._12_4_ = fVar175 * fVar175 * fVar175 * auVar86._12_4_ * -0.5;
        auVar92._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar92._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar92._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar92._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar108);
        auVar102._4_4_ = auVar111._4_4_ * auVar91._4_4_;
        auVar102._0_4_ = auVar111._0_4_ * auVar91._0_4_;
        auVar102._8_4_ = auVar111._8_4_ * auVar91._8_4_;
        auVar102._12_4_ = auVar111._12_4_ * auVar91._12_4_;
        auVar102._16_4_ = auVar111._16_4_ * auVar91._16_4_;
        auVar102._20_4_ = auVar111._20_4_ * auVar91._20_4_;
        auVar102._24_4_ = auVar111._24_4_ * auVar91._24_4_;
        auVar102._28_4_ = auVar108._28_4_;
        auVar93._4_4_ = -auVar110._4_4_ * auVar91._4_4_;
        auVar93._0_4_ = -auVar110._0_4_ * auVar91._0_4_;
        auVar93._8_4_ = -auVar110._8_4_ * auVar91._8_4_;
        auVar93._12_4_ = -auVar110._12_4_ * auVar91._12_4_;
        auVar93._16_4_ = -auVar110._16_4_ * auVar91._16_4_;
        auVar93._20_4_ = -auVar110._20_4_ * auVar91._20_4_;
        auVar93._24_4_ = -auVar110._24_4_ * auVar91._24_4_;
        auVar93._28_4_ = auVar110._28_4_ ^ 0x80000000;
        auVar108 = vmulps_avx512vl(auVar91,auVar97);
        auVar86 = vfmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar85 = vfmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar91 = vfmadd213ps_avx512vl(auVar106,auVar99,auVar105);
        auVar92 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar22),ZEXT1632(auVar20));
        auVar88 = vfnmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar94 = ZEXT1632(auVar22);
        auVar87 = vfmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar21));
        auVar89 = vfnmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar206 = vfmadd213ps_fma(auVar108,auVar94,auVar101);
        auVar104 = vfnmadd231ps_avx512vl(auVar105,auVar99,auVar106);
        auVar20 = vfnmadd213ps_fma(auVar102,auVar94,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar21));
        auVar26 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar22),auVar108);
        auVar108 = vsubps_avx512vl(auVar92,ZEXT1632(auVar88));
        auVar106 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar89));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar206),auVar104);
        auVar102 = vmulps_avx512vl(auVar106,auVar104);
        auVar18 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar89),auVar103);
        auVar94._4_4_ = auVar88._4_4_ * auVar103._4_4_;
        auVar94._0_4_ = auVar88._0_4_ * auVar103._0_4_;
        auVar94._8_4_ = auVar88._8_4_ * auVar103._8_4_;
        auVar94._12_4_ = auVar88._12_4_ * auVar103._12_4_;
        auVar94._16_4_ = auVar103._16_4_ * 0.0;
        auVar94._20_4_ = auVar103._20_4_ * 0.0;
        auVar94._24_4_ = auVar103._24_4_ * 0.0;
        auVar94._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar94,auVar104,auVar108);
        auVar95._4_4_ = auVar89._4_4_ * auVar108._4_4_;
        auVar95._0_4_ = auVar89._0_4_ * auVar108._0_4_;
        auVar95._8_4_ = auVar89._8_4_ * auVar108._8_4_;
        auVar95._12_4_ = auVar89._12_4_ * auVar108._12_4_;
        auVar95._16_4_ = auVar108._16_4_ * 0.0;
        auVar95._20_4_ = auVar108._20_4_ * 0.0;
        auVar95._24_4_ = auVar108._24_4_ * 0.0;
        auVar95._28_4_ = auVar108._28_4_;
        auVar19 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar88),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar97,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,ZEXT1632(auVar18));
        auVar107 = ZEXT1632(auVar90);
        uVar70 = vcmpps_avx512vl(auVar106,auVar107,2);
        bVar72 = (byte)uVar70;
        fVar80 = (float)((uint)(bVar72 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar20._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar128 = (float)((uint)bVar76 * auVar86._4_4_ | (uint)!bVar76 * auVar20._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar130 = (float)((uint)bVar76 * auVar86._8_4_ | (uint)!bVar76 * auVar20._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar132 = (float)((uint)bVar76 * auVar86._12_4_ | (uint)!bVar76 * auVar20._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar80))));
        fVar81 = (float)((uint)(bVar72 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar21._0_4_);
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar129 = (float)((uint)bVar76 * auVar85._4_4_ | (uint)!bVar76 * auVar21._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar131 = (float)((uint)bVar76 * auVar85._8_4_ | (uint)!bVar76 * auVar21._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar133 = (float)((uint)bVar76 * auVar85._12_4_ | (uint)!bVar76 * auVar21._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar81))));
        auVar105._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar26._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar26._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar26._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar26._12_4_);
        fVar163 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_);
        auVar105._16_4_ = fVar163;
        fVar173 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_);
        auVar105._20_4_ = fVar173;
        fVar174 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_);
        auVar105._24_4_ = fVar174;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
        auVar105._28_4_ = iVar1;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar92);
        auVar112._0_4_ =
             (uint)(bVar72 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar18._0_4_;
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar18._4_4_;
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar18._8_4_;
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar18._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar87));
        auVar113._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar85._0_4_
                    );
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar85._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar85._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar85._12_4_);
        fVar158 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_);
        auVar113._16_4_ = fVar158;
        fVar175 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_);
        auVar113._20_4_ = fVar175;
        fVar162 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_);
        auVar113._24_4_ = fVar162;
        auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar206));
        auVar114._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar91._0_4_
                    );
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar91._4_4_);
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar91._8_4_);
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar91._12_4_);
        bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar76 * auVar108._16_4_ | (uint)!bVar76 * auVar91._16_4_);
        bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar76 * auVar108._20_4_ | (uint)!bVar76 * auVar91._20_4_);
        bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar76 * auVar108._24_4_ | (uint)!bVar76 * auVar91._24_4_);
        bVar76 = SUB81(uVar70 >> 7,0);
        auVar114._28_4_ = (uint)bVar76 * auVar108._28_4_ | (uint)!bVar76 * auVar91._28_4_;
        auVar115._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar92._0_4_;
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar76 * (int)auVar88._4_4_ | (uint)!bVar76 * auVar92._4_4_;
        bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar76 * (int)auVar88._8_4_ | (uint)!bVar76 * auVar92._8_4_;
        bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar76 * (int)auVar88._12_4_ | (uint)!bVar76 * auVar92._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar92._28_4_;
        bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar72 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar206._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar206._4_4_;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar206._8_4_;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar206._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar104._28_4_;
        auVar116._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar115,auVar102);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar89._12_4_ |
                                                 (uint)!bVar15 * auVar87._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar89._8_4_ |
                                                          (uint)!bVar13 * auVar87._8_4_,
                                                          CONCAT44((uint)bVar76 * (int)auVar89._4_4_
                                                                   | (uint)!bVar76 * auVar87._4_4_,
                                                                   (uint)(bVar72 & 1) *
                                                                   (int)auVar89._0_4_ |
                                                                   (uint)!(bool)(bVar72 & 1) *
                                                                   auVar87._0_4_)))),auVar93);
        auVar104 = vsubps_avx(auVar116,auVar105);
        auVar103 = vsubps_avx(auVar102,auVar112);
        auVar91 = vsubps_avx(auVar93,auVar113);
        auVar92 = vsubps_avx(auVar105,auVar114);
        auVar97._4_4_ = auVar104._4_4_ * fVar128;
        auVar97._0_4_ = auVar104._0_4_ * fVar80;
        auVar97._8_4_ = auVar104._8_4_ * fVar130;
        auVar97._12_4_ = auVar104._12_4_ * fVar132;
        auVar97._16_4_ = auVar104._16_4_ * 0.0;
        auVar97._20_4_ = auVar104._20_4_ * 0.0;
        auVar97._24_4_ = auVar104._24_4_ * 0.0;
        auVar97._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar97,auVar105,auVar94);
        auVar98._4_4_ = fVar129 * auVar94._4_4_;
        auVar98._0_4_ = fVar81 * auVar94._0_4_;
        auVar98._8_4_ = fVar131 * auVar94._8_4_;
        auVar98._12_4_ = fVar133 * auVar94._12_4_;
        auVar98._16_4_ = auVar94._16_4_ * 0.0;
        auVar98._20_4_ = auVar94._20_4_ * 0.0;
        auVar98._24_4_ = auVar94._24_4_ * 0.0;
        auVar98._28_4_ = auVar106._28_4_;
        auVar85 = vfmsub231ps_fma(auVar98,auVar102,auVar108);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar107,ZEXT1632(auVar86));
        auVar169._0_4_ = auVar108._0_4_ * auVar105._0_4_;
        auVar169._4_4_ = auVar108._4_4_ * auVar105._4_4_;
        auVar169._8_4_ = auVar108._8_4_ * auVar105._8_4_;
        auVar169._12_4_ = auVar108._12_4_ * auVar105._12_4_;
        auVar169._16_4_ = auVar108._16_4_ * fVar163;
        auVar169._20_4_ = auVar108._20_4_ * fVar173;
        auVar169._24_4_ = auVar108._24_4_ * fVar174;
        auVar169._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar169,auVar93,auVar104);
        auVar95 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar86));
        auVar106 = vmulps_avx512vl(auVar92,auVar112);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar114);
        auVar101._4_4_ = auVar91._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar91._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar91._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar91._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar91._16_4_ * auVar114._16_4_;
        auVar101._20_4_ = auVar91._20_4_ * auVar114._20_4_;
        auVar101._24_4_ = auVar91._24_4_ * auVar114._24_4_;
        auVar101._28_4_ = auVar114._28_4_;
        auVar86 = vfmsub231ps_fma(auVar101,auVar113,auVar92);
        auVar170._0_4_ = auVar113._0_4_ * auVar103._0_4_;
        auVar170._4_4_ = auVar113._4_4_ * auVar103._4_4_;
        auVar170._8_4_ = auVar113._8_4_ * auVar103._8_4_;
        auVar170._12_4_ = auVar113._12_4_ * auVar103._12_4_;
        auVar170._16_4_ = fVar158 * auVar103._16_4_;
        auVar170._20_4_ = fVar175 * auVar103._20_4_;
        auVar170._24_4_ = fVar162 * auVar103._24_4_;
        auVar170._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar170,auVar91,auVar112);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar107,auVar106);
        auVar97 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar86));
        auVar106 = vmaxps_avx(auVar95,auVar97);
        uVar136 = vcmpps_avx512vl(auVar106,auVar107,2);
        local_630 = local_630 & (byte)uVar136;
        auVar203 = ZEXT3264(local_7a0);
        auVar204 = ZEXT3264(local_740);
        auVar205 = ZEXT3264(local_7c0);
        auVar202 = ZEXT3264(local_900);
        auVar197 = ZEXT1664(_local_990);
        if (local_630 == 0) {
          local_630 = 0;
        }
        else {
          auVar39._4_4_ = auVar92._4_4_ * auVar108._4_4_;
          auVar39._0_4_ = auVar92._0_4_ * auVar108._0_4_;
          auVar39._8_4_ = auVar92._8_4_ * auVar108._8_4_;
          auVar39._12_4_ = auVar92._12_4_ * auVar108._12_4_;
          auVar39._16_4_ = auVar92._16_4_ * auVar108._16_4_;
          auVar39._20_4_ = auVar92._20_4_ * auVar108._20_4_;
          auVar39._24_4_ = auVar92._24_4_ * auVar108._24_4_;
          auVar39._28_4_ = auVar106._28_4_;
          auVar87 = vfmsub231ps_fma(auVar39,auVar91,auVar104);
          auVar40._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar40._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar40._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar40._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar40._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar40._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar40._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar40._28_4_ = auVar104._28_4_;
          auVar85 = vfmsub231ps_fma(auVar40,auVar94,auVar92);
          auVar41._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar41._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar41._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar41._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar41._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar41._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar41._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar41._28_4_ = auVar91._28_4_;
          auVar206 = vfmsub231ps_fma(auVar41,auVar103,auVar108);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar206));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar87),auVar107);
          auVar108 = vrcp14ps_avx512vl(auVar106);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar32);
          auVar86 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
          auVar42._4_4_ = auVar206._4_4_ * auVar105._4_4_;
          auVar42._0_4_ = auVar206._0_4_ * auVar105._0_4_;
          auVar42._8_4_ = auVar206._8_4_ * auVar105._8_4_;
          auVar42._12_4_ = auVar206._12_4_ * auVar105._12_4_;
          auVar42._16_4_ = fVar163 * 0.0;
          auVar42._20_4_ = fVar173 * 0.0;
          auVar42._24_4_ = fVar174 * 0.0;
          auVar42._28_4_ = iVar1;
          auVar85 = vfmadd231ps_fma(auVar42,auVar93,ZEXT1632(auVar85));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar102,ZEXT1632(auVar87));
          fVar163 = auVar86._0_4_;
          fVar173 = auVar86._4_4_;
          fVar174 = auVar86._8_4_;
          fVar175 = auVar86._12_4_;
          auVar108 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar175,
                                        CONCAT48(auVar85._8_4_ * fVar174,
                                                 CONCAT44(auVar85._4_4_ * fVar173,
                                                          auVar85._0_4_ * fVar163))));
          auVar187._4_4_ = fVar164;
          auVar187._0_4_ = fVar164;
          auVar187._8_4_ = fVar164;
          auVar187._12_4_ = fVar164;
          auVar187._16_4_ = fVar164;
          auVar187._20_4_ = fVar164;
          auVar187._24_4_ = fVar164;
          auVar187._28_4_ = fVar164;
          uVar136 = vcmpps_avx512vl(auVar187,auVar108,2);
          uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar33._4_4_ = uVar135;
          auVar33._0_4_ = uVar135;
          auVar33._8_4_ = uVar135;
          auVar33._12_4_ = uVar135;
          auVar33._16_4_ = uVar135;
          auVar33._20_4_ = uVar135;
          auVar33._24_4_ = uVar135;
          auVar33._28_4_ = uVar135;
          uVar23 = vcmpps_avx512vl(auVar108,auVar33,2);
          local_630 = (byte)uVar136 & (byte)uVar23 & local_630;
          if (local_630 != 0) {
            uVar136 = vcmpps_avx512vl(auVar106,auVar107,4);
            if ((local_630 & (byte)uVar136) != 0) {
              local_630 = local_630 & (byte)uVar136;
              fVar158 = auVar95._0_4_ * fVar163;
              fVar162 = auVar95._4_4_ * fVar173;
              auVar43._4_4_ = fVar162;
              auVar43._0_4_ = fVar158;
              fVar80 = auVar95._8_4_ * fVar174;
              auVar43._8_4_ = fVar80;
              fVar81 = auVar95._12_4_ * fVar175;
              auVar43._12_4_ = fVar81;
              fVar128 = auVar95._16_4_ * 0.0;
              auVar43._16_4_ = fVar128;
              fVar129 = auVar95._20_4_ * 0.0;
              auVar43._20_4_ = fVar129;
              fVar130 = auVar95._24_4_ * 0.0;
              auVar43._24_4_ = fVar130;
              auVar43._28_4_ = auVar95._28_4_;
              fVar163 = auVar97._0_4_ * fVar163;
              fVar173 = auVar97._4_4_ * fVar173;
              auVar44._4_4_ = fVar173;
              auVar44._0_4_ = fVar163;
              fVar174 = auVar97._8_4_ * fVar174;
              auVar44._8_4_ = fVar174;
              fVar175 = auVar97._12_4_ * fVar175;
              auVar44._12_4_ = fVar175;
              fVar131 = auVar97._16_4_ * 0.0;
              auVar44._16_4_ = fVar131;
              fVar132 = auVar97._20_4_ * 0.0;
              auVar44._20_4_ = fVar132;
              fVar133 = auVar97._24_4_ * 0.0;
              auVar44._24_4_ = fVar133;
              auVar44._28_4_ = auVar97._28_4_;
              auVar181._8_4_ = 0x3f800000;
              auVar181._0_8_ = &DAT_3f8000003f800000;
              auVar181._12_4_ = 0x3f800000;
              auVar181._16_4_ = 0x3f800000;
              auVar181._20_4_ = 0x3f800000;
              auVar181._24_4_ = 0x3f800000;
              auVar181._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar181,auVar43);
              local_940._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar158 | (uint)!(bool)(bVar72 & 1) * auVar106._0_4_;
              bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
              local_940._4_4_ = (uint)bVar76 * (int)fVar162 | (uint)!bVar76 * auVar106._4_4_;
              bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
              local_940._8_4_ = (uint)bVar76 * (int)fVar80 | (uint)!bVar76 * auVar106._8_4_;
              bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
              local_940._12_4_ = (uint)bVar76 * (int)fVar81 | (uint)!bVar76 * auVar106._12_4_;
              bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
              local_940._16_4_ = (uint)bVar76 * (int)fVar128 | (uint)!bVar76 * auVar106._16_4_;
              bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
              local_940._20_4_ = (uint)bVar76 * (int)fVar129 | (uint)!bVar76 * auVar106._20_4_;
              bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
              local_940._24_4_ = (uint)bVar76 * (int)fVar130 | (uint)!bVar76 * auVar106._24_4_;
              bVar76 = SUB81(uVar70 >> 7,0);
              local_940._28_4_ = (uint)bVar76 * auVar95._28_4_ | (uint)!bVar76 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar181,auVar44);
              local_540._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar163 | (uint)!(bool)(bVar72 & 1) * auVar106._0_4_;
              bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
              local_540._4_4_ = (uint)bVar76 * (int)fVar173 | (uint)!bVar76 * auVar106._4_4_;
              bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
              local_540._8_4_ = (uint)bVar76 * (int)fVar174 | (uint)!bVar76 * auVar106._8_4_;
              bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
              local_540._12_4_ = (uint)bVar76 * (int)fVar175 | (uint)!bVar76 * auVar106._12_4_;
              bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
              local_540._16_4_ = (uint)bVar76 * (int)fVar131 | (uint)!bVar76 * auVar106._16_4_;
              bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
              local_540._20_4_ = (uint)bVar76 * (int)fVar132 | (uint)!bVar76 * auVar106._20_4_;
              bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
              local_540._24_4_ = (uint)bVar76 * (int)fVar133 | (uint)!bVar76 * auVar106._24_4_;
              bVar76 = SUB81(uVar70 >> 7,0);
              local_540._28_4_ = (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar106._28_4_;
              local_960 = auVar108;
              goto LAB_01c539fa;
            }
          }
          local_630 = 0;
        }
LAB_01c539fa:
        auVar209 = ZEXT3264(local_840);
        auVar147 = ZEXT3264(local_820);
        auVar208 = ZEXT3264(local_800);
        auVar201 = ZEXT3264(auVar96);
        if (local_630 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar22),auVar99);
          auVar86 = vfmadd213ps_fma(auVar106,local_940,auVar99);
          uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar99._4_4_ = uVar135;
          auVar99._0_4_ = uVar135;
          auVar99._8_4_ = uVar135;
          auVar99._12_4_ = uVar135;
          auVar99._16_4_ = uVar135;
          auVar99._20_4_ = uVar135;
          auVar99._24_4_ = uVar135;
          auVar99._28_4_ = uVar135;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                        CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                 CONCAT44(auVar86._4_4_ +
                                                                          auVar86._4_4_,
                                                                          auVar86._0_4_ +
                                                                          auVar86._0_4_)))),auVar99)
          ;
          uVar136 = vcmpps_avx512vl(local_960,auVar106,6);
          local_630 = local_630 & (byte)uVar136;
          if (local_630 != 0) {
            auVar145._8_4_ = 0xbf800000;
            auVar145._0_8_ = 0xbf800000bf800000;
            auVar145._12_4_ = 0xbf800000;
            auVar145._16_4_ = 0xbf800000;
            auVar145._20_4_ = 0xbf800000;
            auVar145._24_4_ = 0xbf800000;
            auVar145._28_4_ = 0xbf800000;
            auVar34._8_4_ = 0x40000000;
            auVar34._0_8_ = 0x4000000040000000;
            auVar34._12_4_ = 0x40000000;
            auVar34._16_4_ = 0x40000000;
            auVar34._20_4_ = 0x40000000;
            auVar34._24_4_ = 0x40000000;
            auVar34._28_4_ = 0x40000000;
            local_6c0 = vfmadd132ps_avx512vl(local_540,auVar145,auVar34);
            local_540 = local_6c0;
            auVar106 = local_540;
            local_680 = 0;
            local_670 = local_970._0_8_;
            uStack_668 = local_970._8_8_;
            local_660 = local_750._0_8_;
            uStack_658 = local_750._8_8_;
            local_650 = local_760._0_8_;
            uStack_648 = local_760._8_8_;
            local_640 = local_770._0_8_;
            uStack_638 = local_770._8_8_;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar76 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar148 = 1.0 / auVar100._0_4_;
                local_620[0] = fVar148 * (local_940._0_4_ + 0.0);
                local_620[1] = fVar148 * (local_940._4_4_ + 1.0);
                local_620[2] = fVar148 * (local_940._8_4_ + 2.0);
                local_620[3] = fVar148 * (local_940._12_4_ + 3.0);
                fStack_610 = fVar148 * (local_940._16_4_ + 4.0);
                fStack_60c = fVar148 * (local_940._20_4_ + 5.0);
                fStack_608 = fVar148 * (local_940._24_4_ + 6.0);
                fStack_604 = local_940._28_4_ + 7.0;
                local_540._0_8_ = local_6c0._0_8_;
                local_540._8_8_ = local_6c0._8_8_;
                local_540._16_8_ = local_6c0._16_8_;
                local_540._24_8_ = local_6c0._24_8_;
                local_600 = local_540._0_8_;
                uStack_5f8 = local_540._8_8_;
                uStack_5f0 = local_540._16_8_;
                uStack_5e8 = local_540._24_8_;
                local_5e0 = local_960;
                local_720 = 0;
                uVar75 = (ulong)local_630;
                for (uVar70 = uVar75; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000)
                {
                  local_720 = local_720 + 1;
                }
                auVar126 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar126);
                local_980 = local_750._0_4_;
                uStack_97c = local_750._4_4_;
                uStack_978 = local_750._8_8_;
                auVar126 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar126);
                local_8c0 = local_760._0_8_;
                uStack_8b8 = local_760._8_8_;
                local_8d0 = local_770._0_4_;
                fStack_8cc = local_770._4_4_;
                fStack_8c8 = local_770._8_4_;
                fStack_8c4 = local_770._12_4_;
                bVar76 = true;
                local_860 = fVar164;
                local_7e0 = auVar96;
                local_6e0 = local_940;
                local_6a0 = local_960;
                local_67c = iVar7;
                local_540 = auVar106;
                do {
                  auVar206 = auVar207._0_16_;
                  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[local_720]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_600 + local_720 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + local_720 * 4);
                  local_9c0.context = context->user;
                  fVar174 = local_200._0_4_;
                  fVar148 = 1.0 - fVar174;
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar87 = vxorps_avx512vl(ZEXT416((uint)fVar148),auVar29);
                  auVar86 = ZEXT416((uint)(fVar174 * fVar148 * 4.0));
                  auVar85 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar86);
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),auVar86);
                  fVar148 = fVar148 * auVar87._0_4_ * 0.5;
                  fVar163 = auVar85._0_4_ * 0.5;
                  fVar173 = auVar86._0_4_ * 0.5;
                  fVar174 = fVar174 * fVar174 * 0.5;
                  auVar179._0_4_ = fVar174 * local_8d0;
                  auVar179._4_4_ = fVar174 * fStack_8cc;
                  auVar179._8_4_ = fVar174 * fStack_8c8;
                  auVar179._12_4_ = fVar174 * fStack_8c4;
                  auVar141._4_4_ = fVar173;
                  auVar141._0_4_ = fVar173;
                  auVar141._8_4_ = fVar173;
                  auVar141._12_4_ = fVar173;
                  auVar66._8_8_ = uStack_8b8;
                  auVar66._0_8_ = local_8c0;
                  auVar86 = vfmadd132ps_fma(auVar141,auVar179,auVar66);
                  auVar167._4_4_ = fVar163;
                  auVar167._0_4_ = fVar163;
                  auVar167._8_4_ = fVar163;
                  auVar167._12_4_ = fVar163;
                  auVar64._4_4_ = uStack_97c;
                  auVar64._0_4_ = local_980;
                  auVar64._8_8_ = uStack_978;
                  auVar86 = vfmadd132ps_fma(auVar167,auVar86,auVar64);
                  auVar142._4_4_ = fVar148;
                  auVar142._0_4_ = fVar148;
                  auVar142._8_4_ = fVar148;
                  auVar142._12_4_ = fVar148;
                  auVar86 = vfmadd132ps_fma(auVar142,auVar86,local_970);
                  auVar126 = vbroadcastss_avx512f(auVar86);
                  auVar127 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar127,ZEXT1664(auVar86));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar127,ZEXT1664(auVar86));
                  local_2c0[0] = (RTCHitN)auVar126[0];
                  local_2c0[1] = (RTCHitN)auVar126[1];
                  local_2c0[2] = (RTCHitN)auVar126[2];
                  local_2c0[3] = (RTCHitN)auVar126[3];
                  local_2c0[4] = (RTCHitN)auVar126[4];
                  local_2c0[5] = (RTCHitN)auVar126[5];
                  local_2c0[6] = (RTCHitN)auVar126[6];
                  local_2c0[7] = (RTCHitN)auVar126[7];
                  local_2c0[8] = (RTCHitN)auVar126[8];
                  local_2c0[9] = (RTCHitN)auVar126[9];
                  local_2c0[10] = (RTCHitN)auVar126[10];
                  local_2c0[0xb] = (RTCHitN)auVar126[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar126[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar126[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar126[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar126[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar126[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar126[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar126[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar126[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar126[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar126[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar126[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar126[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar126[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar126[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar126[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar126[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar126[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar126[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar126[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar126[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar126[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar126[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar126[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar126[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar126[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar126[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar126[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar126[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar126[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar126[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar126[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar126[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar126[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar126[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar126[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar126[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar126[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar126[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar126[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar126[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar126[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar126[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar126[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar126[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar126[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar126[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar126[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar126[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar126[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar126[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar126[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar126[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar126 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar126);
                  vpcmpeqd_avx2(auVar126._0_32_,auVar126._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                  local_5c0 = local_300;
                  local_9c0.valid = (int *)local_5c0;
                  local_9c0.geometryUserPtr = pGVar8->userPtr;
                  local_9c0.hit = local_2c0;
                  local_9c0.N = 0x10;
                  local_700 = (undefined4)uVar75;
                  uStack_6fc = (undefined4)(uVar75 >> 0x20);
                  local_9c0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_9c0);
                    uVar75 = CONCAT44(uStack_6fc,local_700);
                    auVar197 = ZEXT1664(_local_990);
                    auVar201 = ZEXT3264(local_7e0);
                    auVar209 = ZEXT3264(local_840);
                    auVar147 = ZEXT3264(local_820);
                    auVar208 = ZEXT3264(local_800);
                    auVar210 = ZEXT3264(local_920);
                    auVar202 = ZEXT3264(local_900);
                    auVar205 = ZEXT3264(local_7c0);
                    auVar204 = ZEXT3264(local_740);
                    auVar203 = ZEXT3264(local_7a0);
                    auVar86 = vxorps_avx512vl(auVar206,auVar206);
                    auVar207 = ZEXT1664(auVar86);
                    fVar164 = local_860;
                  }
                  auVar86 = auVar207._0_16_;
                  auVar126 = vmovdqa64_avx512f(local_5c0);
                  uVar136 = vptestmd_avx512f(auVar126,auVar126);
                  if ((short)uVar136 != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_9c0);
                      uVar75 = CONCAT44(uStack_6fc,local_700);
                      auVar197 = ZEXT1664(_local_990);
                      auVar201 = ZEXT3264(local_7e0);
                      auVar209 = ZEXT3264(local_840);
                      auVar147 = ZEXT3264(local_820);
                      auVar208 = ZEXT3264(local_800);
                      auVar210 = ZEXT3264(local_920);
                      auVar202 = ZEXT3264(local_900);
                      auVar205 = ZEXT3264(local_7c0);
                      auVar204 = ZEXT3264(local_740);
                      auVar203 = ZEXT3264(local_7a0);
                      auVar86 = vxorps_avx512vl(auVar86,auVar86);
                      auVar207 = ZEXT1664(auVar86);
                      fVar164 = local_860;
                    }
                    auVar96 = auVar201._0_32_;
                    auVar126 = vmovdqa64_avx512f(local_5c0);
                    uVar70 = vptestmd_avx512f(auVar126,auVar126);
                    auVar127 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar70 & 1);
                    auVar126._0_4_ =
                         (uint)bVar12 * auVar127._0_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x200);
                    bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                    auVar126._4_4_ =
                         (uint)bVar12 * auVar127._4_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x204);
                    bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                    auVar126._8_4_ =
                         (uint)bVar12 * auVar127._8_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x208);
                    bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                    auVar126._12_4_ =
                         (uint)bVar12 * auVar127._12_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x20c);
                    bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                    auVar126._16_4_ =
                         (uint)bVar12 * auVar127._16_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x210);
                    bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                    auVar126._20_4_ =
                         (uint)bVar12 * auVar127._20_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x214);
                    bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                    auVar126._24_4_ =
                         (uint)bVar12 * auVar127._24_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x218);
                    bVar12 = (bool)((byte)(uVar70 >> 7) & 1);
                    auVar126._28_4_ =
                         (uint)bVar12 * auVar127._28_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x21c);
                    bVar12 = (bool)((byte)(uVar70 >> 8) & 1);
                    auVar126._32_4_ =
                         (uint)bVar12 * auVar127._32_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x220);
                    bVar12 = (bool)((byte)(uVar70 >> 9) & 1);
                    auVar126._36_4_ =
                         (uint)bVar12 * auVar127._36_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x224);
                    bVar12 = (bool)((byte)(uVar70 >> 10) & 1);
                    auVar126._40_4_ =
                         (uint)bVar12 * auVar127._40_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x228);
                    bVar12 = (bool)((byte)(uVar70 >> 0xb) & 1);
                    auVar126._44_4_ =
                         (uint)bVar12 * auVar127._44_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x22c);
                    bVar12 = (bool)((byte)(uVar70 >> 0xc) & 1);
                    auVar126._48_4_ =
                         (uint)bVar12 * auVar127._48_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x230);
                    bVar12 = (bool)((byte)(uVar70 >> 0xd) & 1);
                    auVar126._52_4_ =
                         (uint)bVar12 * auVar127._52_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x234);
                    bVar12 = (bool)((byte)(uVar70 >> 0xe) & 1);
                    auVar126._56_4_ =
                         (uint)bVar12 * auVar127._56_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x238);
                    bVar12 = SUB81(uVar70 >> 0xf,0);
                    auVar126._60_4_ =
                         (uint)bVar12 * auVar127._60_4_ |
                         (uint)!bVar12 * *(int *)(local_9c0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar126;
                    fVar148 = auVar197._0_4_;
                    if ((short)uVar70 != 0) break;
                  }
                  auVar96 = auVar201._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar135;
                  uVar70 = local_720 & 0x3f;
                  local_720 = 0;
                  uVar75 = uVar75 ^ 1L << uVar70;
                  for (uVar70 = uVar75; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000
                      ) {
                    local_720 = local_720 + 1;
                  }
                  bVar76 = uVar75 != 0;
                  fVar148 = auVar197._0_4_;
                } while (bVar76);
              }
              goto LAB_01c53ff9;
            }
          }
        }
        bVar76 = false;
      }
LAB_01c53ff9:
      local_860 = fVar148;
      if (8 < iVar7) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar201 = ZEXT3264(auVar106);
        fStack_718 = 1.0 / (float)local_480._0_4_;
        auVar197 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar197);
        auVar197 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar197);
        lVar78 = 8;
        fStack_85c = local_860;
        fStack_858 = local_860;
        fStack_854 = local_860;
        fStack_850 = local_860;
        fStack_84c = local_860;
        fStack_848 = local_860;
        fStack_844 = local_860;
        local_7e0 = auVar96;
        fStack_714 = fStack_718;
        fStack_710 = fStack_718;
        fStack_70c = fStack_718;
        fStack_708 = fStack_718;
        fStack_704 = fStack_718;
        local_700 = fVar164;
        uStack_6fc = fVar164;
        uStack_6f8 = fVar164;
        uStack_6f4 = fVar164;
        uStack_6f0 = fVar164;
        uStack_6ec = fVar164;
        uStack_6e8 = fVar164;
        uStack_6e4 = fVar164;
        local_720._0_4_ = fStack_718;
        local_720._4_4_ = fStack_718;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar91 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar23 = vpcmpgtd_avx512vl(auVar201._0_32_,auVar91);
          auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 * 4 + lVar24);
          auVar108 = *(undefined1 (*) [32])(lVar24 + 0x222bfac + lVar78 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar24 + 0x222c430 + lVar78 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar24 + 0x222c8b4 + lVar78 * 4);
          local_820 = auVar147._0_32_;
          auVar92 = vmulps_avx512vl(local_820,auVar103);
          local_840 = auVar209._0_32_;
          auVar102 = vmulps_avx512vl(local_840,auVar103);
          auVar45._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
          auVar45._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
          auVar45._8_4_ = auVar103._8_4_ * fStack_378;
          auVar45._12_4_ = auVar103._12_4_ * fStack_374;
          auVar45._16_4_ = auVar103._16_4_ * fStack_370;
          auVar45._20_4_ = auVar103._20_4_ * fStack_36c;
          auVar45._24_4_ = auVar103._24_4_ * fStack_368;
          auVar45._28_4_ = auVar91._28_4_;
          auVar111 = auVar210._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar92,auVar104,auVar111);
          local_800 = auVar208._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar102,auVar104,local_800);
          auVar102 = vfmadd231ps_avx512vl(auVar45,auVar104,local_360);
          auVar110 = auVar205._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar110);
          auVar107 = auVar202._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar108,auVar107);
          auVar86 = vfmadd231ps_fma(auVar102,auVar108,local_340);
          auVar109 = auVar203._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar91,auVar106,auVar109);
          local_740 = auVar204._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar106,local_740);
          auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 * 4 + lVar24);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x222e3cc + lVar78 * 4);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar106,local_320);
          auVar102 = *(undefined1 (*) [32])(lVar24 + 0x222e850 + lVar78 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar24 + 0x222ecd4 + lVar78 * 4);
          auVar96 = vmulps_avx512vl(local_820,auVar93);
          auVar94 = vmulps_avx512vl(local_840,auVar93);
          auVar46._4_4_ = auVar93._4_4_ * (float)local_380._4_4_;
          auVar46._0_4_ = auVar93._0_4_ * (float)local_380._0_4_;
          auVar46._8_4_ = auVar93._8_4_ * fStack_378;
          auVar46._12_4_ = auVar93._12_4_ * fStack_374;
          auVar46._16_4_ = auVar93._16_4_ * fStack_370;
          auVar46._20_4_ = auVar93._20_4_ * fStack_36c;
          auVar46._24_4_ = auVar93._24_4_ * fStack_368;
          auVar46._28_4_ = uStack_364;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar111);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_800);
          auVar98 = vfmadd231ps_avx512vl(auVar46,auVar102,local_360);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar110);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar107);
          auVar85 = vfmadd231ps_fma(auVar98,auVar92,local_340);
          auVar98 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar109);
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar91,local_740);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar91,local_320);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar85));
          auVar96 = vsubps_avx(auVar98,auVar95);
          auVar94 = vsubps_avx(auVar99,auVar97);
          auVar101 = vmulps_avx512vl(auVar97,auVar96);
          auVar105 = vmulps_avx512vl(auVar95,auVar94);
          auVar101 = vsubps_avx512vl(auVar101,auVar105);
          auVar105 = vmulps_avx512vl(auVar94,auVar94);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar96);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar105);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar136 = vcmpps_avx512vl(auVar101,auVar100,2);
          local_630 = (byte)uVar23 & (byte)uVar136;
          if (local_630 == 0) {
            auVar197 = ZEXT3264(auVar107);
            auVar210 = ZEXT3264(auVar111);
          }
          else {
            auVar93 = vmulps_avx512vl(local_7e0,auVar93);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_3e0,auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar102);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar92);
            auVar103 = vmulps_avx512vl(local_7e0,auVar103);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar103);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_3c0,auVar104);
            auVar92 = vfmadd213ps_avx512vl(auVar106,local_3a0,auVar108);
            auVar106 = *(undefined1 (*) [32])(lVar24 + 0x222cd38 + lVar78 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x222d1bc + lVar78 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar24 + 0x222d640 + lVar78 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar24 + 0x222dac4 + lVar78 * 4);
            auVar102 = vmulps_avx512vl(local_820,auVar103);
            auVar93 = vmulps_avx512vl(local_840,auVar103);
            auVar103 = vmulps_avx512vl(local_7e0,auVar103);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar111);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_800);
            auVar104 = vfmadd231ps_avx512vl(auVar103,local_3e0,auVar104);
            auVar103 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar110);
            auVar102 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar107);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar109);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_740);
            auVar93 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar24 + 0x222f158 + lVar78 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x222fa60 + lVar78 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar24 + 0x222fee4 + lVar78 * 4);
            auVar100 = vmulps_avx512vl(local_820,auVar104);
            auVar101 = vmulps_avx512vl(local_840,auVar104);
            auVar104 = vmulps_avx512vl(local_7e0,auVar104);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar111);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_800);
            auVar104 = vfmadd231ps_avx512vl(auVar104,local_3e0,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar24 + 0x222f5dc + lVar78 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar110);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar107);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
            auVar104 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar109);
            auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,local_740);
            auVar108 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar103,auVar101);
            vandps_avx512vl(auVar102,auVar101);
            auVar106 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar93,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar101);
            auVar68._4_4_ = fStack_85c;
            auVar68._0_4_ = local_860;
            auVar68._8_4_ = fStack_858;
            auVar68._12_4_ = fStack_854;
            auVar68._16_4_ = fStack_850;
            auVar68._20_4_ = fStack_84c;
            auVar68._24_4_ = fStack_848;
            auVar68._28_4_ = fStack_844;
            uVar70 = vcmpps_avx512vl(auVar106,auVar68,1);
            bVar12 = (bool)((byte)uVar70 & 1);
            auVar117._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar103._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar103._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar103._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar103._12_4_);
            bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar103._16_4_);
            bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar103._20_4_);
            bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar103._24_4_);
            bVar12 = SUB81(uVar70 >> 7,0);
            auVar117._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar103._28_4_;
            bVar12 = (bool)((byte)uVar70 & 1);
            auVar118._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar102._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar102._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar102._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar102._12_4_);
            bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar102._16_4_);
            bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar102._20_4_);
            bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar102._24_4_);
            bVar12 = SUB81(uVar70 >> 7,0);
            auVar118._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar102._28_4_;
            vandps_avx512vl(auVar104,auVar101);
            vandps_avx512vl(auVar100,auVar101);
            auVar106 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar108,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar118);
            uVar70 = vcmpps_avx512vl(auVar106,auVar68,1);
            bVar12 = (bool)((byte)uVar70 & 1);
            auVar119._0_4_ = (uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar104._0_4_;
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar104._4_4_;
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar104._8_4_;
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar104._12_4_;
            bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar104._16_4_;
            bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar104._20_4_;
            bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar104._24_4_;
            bVar12 = SUB81(uVar70 >> 7,0);
            auVar119._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar104._28_4_;
            bVar12 = (bool)((byte)uVar70 & 1);
            auVar120._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar100._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar100._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar100._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar100._12_4_);
            bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar100._16_4_);
            bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar100._20_4_);
            bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar100._24_4_);
            bVar12 = SUB81(uVar70 >> 7,0);
            auVar120._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar100._28_4_;
            auVar191._8_4_ = 0x80000000;
            auVar191._0_8_ = 0x8000000080000000;
            auVar191._12_4_ = 0x80000000;
            auVar191._16_4_ = 0x80000000;
            auVar191._20_4_ = 0x80000000;
            auVar191._24_4_ = 0x80000000;
            auVar191._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar119,auVar191);
            auVar100 = auVar207._0_32_;
            auVar108 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar100);
            auVar87 = vfmadd231ps_fma(auVar108,auVar118,auVar118);
            auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
            auVar200._8_4_ = 0xbf000000;
            auVar200._0_8_ = 0xbf000000bf000000;
            auVar200._12_4_ = 0xbf000000;
            auVar200._16_4_ = 0xbf000000;
            auVar200._20_4_ = 0xbf000000;
            auVar200._24_4_ = 0xbf000000;
            auVar200._28_4_ = 0xbf000000;
            fVar164 = auVar108._0_4_;
            fVar148 = auVar108._4_4_;
            fVar163 = auVar108._8_4_;
            fVar173 = auVar108._12_4_;
            fVar174 = auVar108._16_4_;
            fVar175 = auVar108._20_4_;
            fVar158 = auVar108._24_4_;
            auVar47._4_4_ = fVar148 * fVar148 * fVar148 * auVar87._4_4_ * -0.5;
            auVar47._0_4_ = fVar164 * fVar164 * fVar164 * auVar87._0_4_ * -0.5;
            auVar47._8_4_ = fVar163 * fVar163 * fVar163 * auVar87._8_4_ * -0.5;
            auVar47._12_4_ = fVar173 * fVar173 * fVar173 * auVar87._12_4_ * -0.5;
            auVar47._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar47._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar47._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
            auVar47._28_4_ = auVar118._28_4_;
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar108 = vfmadd231ps_avx512vl(auVar47,auVar104,auVar108);
            auVar48._4_4_ = auVar118._4_4_ * auVar108._4_4_;
            auVar48._0_4_ = auVar118._0_4_ * auVar108._0_4_;
            auVar48._8_4_ = auVar118._8_4_ * auVar108._8_4_;
            auVar48._12_4_ = auVar118._12_4_ * auVar108._12_4_;
            auVar48._16_4_ = auVar118._16_4_ * auVar108._16_4_;
            auVar48._20_4_ = auVar118._20_4_ * auVar108._20_4_;
            auVar48._24_4_ = auVar118._24_4_ * auVar108._24_4_;
            auVar48._28_4_ = 0;
            auVar49._4_4_ = auVar108._4_4_ * -auVar117._4_4_;
            auVar49._0_4_ = auVar108._0_4_ * -auVar117._0_4_;
            auVar49._8_4_ = auVar108._8_4_ * -auVar117._8_4_;
            auVar49._12_4_ = auVar108._12_4_ * -auVar117._12_4_;
            auVar49._16_4_ = auVar108._16_4_ * -auVar117._16_4_;
            auVar49._20_4_ = auVar108._20_4_ * -auVar117._20_4_;
            auVar49._24_4_ = auVar108._24_4_ * -auVar117._24_4_;
            auVar49._28_4_ = auVar118._28_4_;
            auVar103 = vmulps_avx512vl(auVar108,auVar100);
            auVar108 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar100);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,auVar120);
            auVar102 = vrsqrt14ps_avx512vl(auVar108);
            auVar108 = vmulps_avx512vl(auVar108,auVar200);
            fVar164 = auVar102._0_4_;
            fVar148 = auVar102._4_4_;
            fVar163 = auVar102._8_4_;
            fVar173 = auVar102._12_4_;
            fVar174 = auVar102._16_4_;
            fVar175 = auVar102._20_4_;
            fVar158 = auVar102._24_4_;
            auVar50._4_4_ = fVar148 * fVar148 * fVar148 * auVar108._4_4_;
            auVar50._0_4_ = fVar164 * fVar164 * fVar164 * auVar108._0_4_;
            auVar50._8_4_ = fVar163 * fVar163 * fVar163 * auVar108._8_4_;
            auVar50._12_4_ = fVar173 * fVar173 * fVar173 * auVar108._12_4_;
            auVar50._16_4_ = fVar174 * fVar174 * fVar174 * auVar108._16_4_;
            auVar50._20_4_ = fVar175 * fVar175 * fVar175 * auVar108._20_4_;
            auVar50._24_4_ = fVar158 * fVar158 * fVar158 * auVar108._24_4_;
            auVar50._28_4_ = auVar108._28_4_;
            auVar108 = vfmadd231ps_avx512vl(auVar50,auVar104,auVar102);
            auVar51._4_4_ = auVar120._4_4_ * auVar108._4_4_;
            auVar51._0_4_ = auVar120._0_4_ * auVar108._0_4_;
            auVar51._8_4_ = auVar120._8_4_ * auVar108._8_4_;
            auVar51._12_4_ = auVar120._12_4_ * auVar108._12_4_;
            auVar51._16_4_ = auVar120._16_4_ * auVar108._16_4_;
            auVar51._20_4_ = auVar120._20_4_ * auVar108._20_4_;
            auVar51._24_4_ = auVar120._24_4_ * auVar108._24_4_;
            auVar51._28_4_ = auVar102._28_4_;
            auVar52._4_4_ = auVar108._4_4_ * auVar106._4_4_;
            auVar52._0_4_ = auVar108._0_4_ * auVar106._0_4_;
            auVar52._8_4_ = auVar108._8_4_ * auVar106._8_4_;
            auVar52._12_4_ = auVar108._12_4_ * auVar106._12_4_;
            auVar52._16_4_ = auVar108._16_4_ * auVar106._16_4_;
            auVar52._20_4_ = auVar108._20_4_ * auVar106._20_4_;
            auVar52._24_4_ = auVar108._24_4_ * auVar106._24_4_;
            auVar52._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar108,auVar100);
            auVar87 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar86),auVar95);
            auVar108 = ZEXT1632(auVar86);
            auVar206 = vfmadd213ps_fma(auVar49,auVar108,auVar97);
            auVar104 = vfmadd213ps_avx512vl(auVar103,auVar108,auVar92);
            auVar102 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar85),auVar98);
            auVar22 = vfnmadd213ps_fma(auVar48,auVar108,auVar95);
            auVar93 = ZEXT1632(auVar85);
            auVar18 = vfmadd213ps_fma(auVar52,auVar93,auVar99);
            auVar88 = vfnmadd213ps_fma(auVar49,auVar108,auVar97);
            auVar19 = vfmadd213ps_fma(auVar106,auVar93,auVar91);
            auVar97 = ZEXT1632(auVar86);
            auVar90 = vfnmadd231ps_fma(auVar92,auVar97,auVar103);
            auVar89 = vfnmadd213ps_fma(auVar51,auVar93,auVar98);
            auVar26 = vfnmadd213ps_fma(auVar52,auVar93,auVar99);
            auVar27 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar85),auVar106);
            auVar91 = vsubps_avx512vl(auVar102,ZEXT1632(auVar22));
            auVar106 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar88));
            auVar108 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar90));
            auVar53._4_4_ = auVar106._4_4_ * auVar90._4_4_;
            auVar53._0_4_ = auVar106._0_4_ * auVar90._0_4_;
            auVar53._8_4_ = auVar106._8_4_ * auVar90._8_4_;
            auVar53._12_4_ = auVar106._12_4_ * auVar90._12_4_;
            auVar53._16_4_ = auVar106._16_4_ * 0.0;
            auVar53._20_4_ = auVar106._20_4_ * 0.0;
            auVar53._24_4_ = auVar106._24_4_ * 0.0;
            auVar53._28_4_ = auVar103._28_4_;
            auVar86 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar88),auVar108);
            auVar54._4_4_ = auVar108._4_4_ * auVar22._4_4_;
            auVar54._0_4_ = auVar108._0_4_ * auVar22._0_4_;
            auVar54._8_4_ = auVar108._8_4_ * auVar22._8_4_;
            auVar54._12_4_ = auVar108._12_4_ * auVar22._12_4_;
            auVar54._16_4_ = auVar108._16_4_ * 0.0;
            auVar54._20_4_ = auVar108._20_4_ * 0.0;
            auVar54._24_4_ = auVar108._24_4_ * 0.0;
            auVar54._28_4_ = auVar108._28_4_;
            auVar20 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar90),auVar91);
            auVar55._4_4_ = auVar88._4_4_ * auVar91._4_4_;
            auVar55._0_4_ = auVar88._0_4_ * auVar91._0_4_;
            auVar55._8_4_ = auVar88._8_4_ * auVar91._8_4_;
            auVar55._12_4_ = auVar88._12_4_ * auVar91._12_4_;
            auVar55._16_4_ = auVar91._16_4_ * 0.0;
            auVar55._20_4_ = auVar91._20_4_ * 0.0;
            auVar55._24_4_ = auVar91._24_4_ * 0.0;
            auVar55._28_4_ = auVar91._28_4_;
            auVar21 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar22),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar100,ZEXT1632(auVar20));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar86));
            uVar70 = vcmpps_avx512vl(auVar106,auVar100,2);
            bVar72 = (byte)uVar70;
            fVar81 = (float)((uint)(bVar72 & 1) * auVar87._0_4_ |
                            (uint)!(bool)(bVar72 & 1) * auVar89._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar129 = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar89._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar131 = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar89._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar133 = (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar89._12_4_);
            auVar93 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar81))));
            fVar128 = (float)((uint)(bVar72 & 1) * auVar206._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * auVar26._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar130 = (float)((uint)bVar12 * auVar206._4_4_ | (uint)!bVar12 * auVar26._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar132 = (float)((uint)bVar12 * auVar206._8_4_ | (uint)!bVar12 * auVar26._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar134 = (float)((uint)bVar12 * auVar206._12_4_ | (uint)!bVar12 * auVar26._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar128))));
            auVar121._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            fVar148 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_);
            auVar121._16_4_ = fVar148;
            fVar164 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_);
            auVar121._20_4_ = fVar164;
            fVar163 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_);
            auVar121._24_4_ = fVar163;
            iVar1 = (uint)(byte)(uVar70 >> 7) * auVar104._28_4_;
            auVar121._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar102);
            auVar122._0_4_ =
                 (uint)(bVar72 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar86._0_4_;
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar86._4_4_;
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar86._8_4_;
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar86._12_4_;
            auVar122._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_;
            auVar122._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_;
            auVar122._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_;
            auVar122._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar18));
            auVar123._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar87._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar87._4_4_);
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar87._8_4_);
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar87._12_4_);
            fVar174 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
            auVar123._16_4_ = fVar174;
            fVar173 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
            auVar123._20_4_ = fVar173;
            fVar175 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
            auVar123._24_4_ = fVar175;
            auVar123._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar19));
            auVar124._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar206._0_4_);
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar206._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar206._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar206._12_4_);
            fVar158 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
            auVar124._16_4_ = fVar158;
            fVar162 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
            auVar124._20_4_ = fVar162;
            fVar80 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
            auVar124._24_4_ = fVar80;
            iVar2 = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
            auVar124._28_4_ = iVar2;
            auVar125._0_4_ =
                 (uint)(bVar72 & 1) * (int)auVar22._0_4_ |
                 (uint)!(bool)(bVar72 & 1) * auVar102._0_4_;
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar12 * (int)auVar22._4_4_ | (uint)!bVar12 * auVar102._4_4_;
            bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar12 * (int)auVar22._8_4_ | (uint)!bVar12 * auVar102._8_4_;
            bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar12 * (int)auVar22._12_4_ | (uint)!bVar12 * auVar102._12_4_;
            auVar125._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar102._16_4_;
            auVar125._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar102._20_4_;
            auVar125._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar102._24_4_;
            auVar125._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar102._28_4_;
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar125,auVar93);
            auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar88._12_4_ |
                                                     (uint)!bVar16 * auVar18._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                              (uint)!bVar15 * auVar18._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar88._4_4_ |
                                                                       (uint)!bVar12 * auVar18._4_4_
                                                                       ,(uint)(bVar72 & 1) *
                                                                        (int)auVar88._0_4_ |
                                                                        (uint)!(bool)(bVar72 & 1) *
                                                                        auVar18._0_4_)))),auVar96);
            auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar90._12_4_ |
                                                     (uint)!bVar17 * auVar19._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar90._8_4_ |
                                                              (uint)!bVar14 * auVar19._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar90._4_4_ |
                                                                       (uint)!bVar13 * auVar19._4_4_
                                                                       ,(uint)(bVar72 & 1) *
                                                                        (int)auVar90._0_4_ |
                                                                        (uint)!(bool)(bVar72 & 1) *
                                                                        auVar19._0_4_)))),auVar121);
            auVar103 = vsubps_avx(auVar93,auVar122);
            auVar91 = vsubps_avx(auVar96,auVar123);
            auVar92 = vsubps_avx(auVar121,auVar124);
            auVar56._4_4_ = auVar104._4_4_ * fVar129;
            auVar56._0_4_ = auVar104._0_4_ * fVar81;
            auVar56._8_4_ = auVar104._8_4_ * fVar131;
            auVar56._12_4_ = auVar104._12_4_ * fVar133;
            auVar56._16_4_ = auVar104._16_4_ * 0.0;
            auVar56._20_4_ = auVar104._20_4_ * 0.0;
            auVar56._24_4_ = auVar104._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar56,auVar121,auVar102);
            auVar161._0_4_ = fVar128 * auVar102._0_4_;
            auVar161._4_4_ = fVar130 * auVar102._4_4_;
            auVar161._8_4_ = fVar132 * auVar102._8_4_;
            auVar161._12_4_ = fVar134 * auVar102._12_4_;
            auVar161._16_4_ = auVar102._16_4_ * 0.0;
            auVar161._20_4_ = auVar102._20_4_ * 0.0;
            auVar161._24_4_ = auVar102._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar161,auVar93,auVar108);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar100,ZEXT1632(auVar86));
            auVar171._0_4_ = auVar108._0_4_ * auVar121._0_4_;
            auVar171._4_4_ = auVar108._4_4_ * auVar121._4_4_;
            auVar171._8_4_ = auVar108._8_4_ * auVar121._8_4_;
            auVar171._12_4_ = auVar108._12_4_ * auVar121._12_4_;
            auVar171._16_4_ = auVar108._16_4_ * fVar148;
            auVar171._20_4_ = auVar108._20_4_ * fVar164;
            auVar171._24_4_ = auVar108._24_4_ * fVar163;
            auVar171._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar171,auVar96,auVar104);
            auVar94 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar86));
            auVar106 = vmulps_avx512vl(auVar92,auVar122);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar124);
            auVar57._4_4_ = auVar91._4_4_ * auVar124._4_4_;
            auVar57._0_4_ = auVar91._0_4_ * auVar124._0_4_;
            auVar57._8_4_ = auVar91._8_4_ * auVar124._8_4_;
            auVar57._12_4_ = auVar91._12_4_ * auVar124._12_4_;
            auVar57._16_4_ = auVar91._16_4_ * fVar158;
            auVar57._20_4_ = auVar91._20_4_ * fVar162;
            auVar57._24_4_ = auVar91._24_4_ * fVar80;
            auVar57._28_4_ = iVar2;
            auVar86 = vfmsub231ps_fma(auVar57,auVar123,auVar92);
            auVar172._0_4_ = auVar123._0_4_ * auVar103._0_4_;
            auVar172._4_4_ = auVar123._4_4_ * auVar103._4_4_;
            auVar172._8_4_ = auVar123._8_4_ * auVar103._8_4_;
            auVar172._12_4_ = auVar123._12_4_ * auVar103._12_4_;
            auVar172._16_4_ = fVar174 * auVar103._16_4_;
            auVar172._20_4_ = fVar173 * auVar103._20_4_;
            auVar172._24_4_ = fVar175 * auVar103._24_4_;
            auVar172._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar172,auVar91,auVar122);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar100,auVar106);
            auVar95 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar86));
            auVar106 = vmaxps_avx(auVar94,auVar95);
            uVar136 = vcmpps_avx512vl(auVar106,auVar100,2);
            local_630 = local_630 & (byte)uVar136;
            if (local_630 == 0) {
LAB_01c54c00:
              local_630 = 0;
            }
            else {
              auVar58._4_4_ = auVar92._4_4_ * auVar108._4_4_;
              auVar58._0_4_ = auVar92._0_4_ * auVar108._0_4_;
              auVar58._8_4_ = auVar92._8_4_ * auVar108._8_4_;
              auVar58._12_4_ = auVar92._12_4_ * auVar108._12_4_;
              auVar58._16_4_ = auVar92._16_4_ * auVar108._16_4_;
              auVar58._20_4_ = auVar92._20_4_ * auVar108._20_4_;
              auVar58._24_4_ = auVar92._24_4_ * auVar108._24_4_;
              auVar58._28_4_ = auVar106._28_4_;
              auVar206 = vfmsub231ps_fma(auVar58,auVar91,auVar104);
              auVar59._4_4_ = auVar104._4_4_ * auVar103._4_4_;
              auVar59._0_4_ = auVar104._0_4_ * auVar103._0_4_;
              auVar59._8_4_ = auVar104._8_4_ * auVar103._8_4_;
              auVar59._12_4_ = auVar104._12_4_ * auVar103._12_4_;
              auVar59._16_4_ = auVar104._16_4_ * auVar103._16_4_;
              auVar59._20_4_ = auVar104._20_4_ * auVar103._20_4_;
              auVar59._24_4_ = auVar104._24_4_ * auVar103._24_4_;
              auVar59._28_4_ = auVar104._28_4_;
              auVar87 = vfmsub231ps_fma(auVar59,auVar102,auVar92);
              auVar60._4_4_ = auVar91._4_4_ * auVar102._4_4_;
              auVar60._0_4_ = auVar91._0_4_ * auVar102._0_4_;
              auVar60._8_4_ = auVar91._8_4_ * auVar102._8_4_;
              auVar60._12_4_ = auVar91._12_4_ * auVar102._12_4_;
              auVar60._16_4_ = auVar91._16_4_ * auVar102._16_4_;
              auVar60._20_4_ = auVar91._20_4_ * auVar102._20_4_;
              auVar60._24_4_ = auVar91._24_4_ * auVar102._24_4_;
              auVar60._28_4_ = auVar91._28_4_;
              auVar18 = vfmsub231ps_fma(auVar60,auVar103,auVar108);
              auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar18));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar206),auVar100);
              auVar108 = vrcp14ps_avx512vl(auVar106);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar35);
              auVar86 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
              auVar61._4_4_ = auVar18._4_4_ * auVar121._4_4_;
              auVar61._0_4_ = auVar18._0_4_ * auVar121._0_4_;
              auVar61._8_4_ = auVar18._8_4_ * auVar121._8_4_;
              auVar61._12_4_ = auVar18._12_4_ * auVar121._12_4_;
              auVar61._16_4_ = fVar148 * 0.0;
              auVar61._20_4_ = fVar164 * 0.0;
              auVar61._24_4_ = fVar163 * 0.0;
              auVar61._28_4_ = iVar1;
              auVar87 = vfmadd231ps_fma(auVar61,auVar96,ZEXT1632(auVar87));
              auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar93,ZEXT1632(auVar206));
              fVar164 = auVar86._0_4_;
              fVar148 = auVar86._4_4_;
              fVar163 = auVar86._8_4_;
              fVar173 = auVar86._12_4_;
              auVar108 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar173,
                                            CONCAT48(auVar87._8_4_ * fVar163,
                                                     CONCAT44(auVar87._4_4_ * fVar148,
                                                              auVar87._0_4_ * fVar164))));
              auVar69._4_4_ = uStack_6fc;
              auVar69._0_4_ = local_700;
              auVar69._8_4_ = uStack_6f8;
              auVar69._12_4_ = uStack_6f4;
              auVar69._16_4_ = uStack_6f0;
              auVar69._20_4_ = uStack_6ec;
              auVar69._24_4_ = uStack_6e8;
              auVar69._28_4_ = uStack_6e4;
              uVar136 = vcmpps_avx512vl(auVar108,auVar69,0xd);
              uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar36._4_4_ = uVar135;
              auVar36._0_4_ = uVar135;
              auVar36._8_4_ = uVar135;
              auVar36._12_4_ = uVar135;
              auVar36._16_4_ = uVar135;
              auVar36._20_4_ = uVar135;
              auVar36._24_4_ = uVar135;
              auVar36._28_4_ = uVar135;
              uVar23 = vcmpps_avx512vl(auVar108,auVar36,2);
              local_630 = (byte)uVar136 & (byte)uVar23 & local_630;
              if (local_630 == 0) goto LAB_01c54c00;
              uVar136 = vcmpps_avx512vl(auVar106,auVar100,4);
              if ((local_630 & (byte)uVar136) == 0) {
                local_630 = 0;
              }
              else {
                local_630 = local_630 & (byte)uVar136;
                fVar174 = auVar94._0_4_ * fVar164;
                fVar175 = auVar94._4_4_ * fVar148;
                auVar62._4_4_ = fVar175;
                auVar62._0_4_ = fVar174;
                fVar158 = auVar94._8_4_ * fVar163;
                auVar62._8_4_ = fVar158;
                fVar162 = auVar94._12_4_ * fVar173;
                auVar62._12_4_ = fVar162;
                fVar80 = auVar94._16_4_ * 0.0;
                auVar62._16_4_ = fVar80;
                fVar81 = auVar94._20_4_ * 0.0;
                auVar62._20_4_ = fVar81;
                fVar128 = auVar94._24_4_ * 0.0;
                auVar62._24_4_ = fVar128;
                auVar62._28_4_ = auVar94._28_4_;
                fVar164 = auVar95._0_4_ * fVar164;
                fVar148 = auVar95._4_4_ * fVar148;
                auVar63._4_4_ = fVar148;
                auVar63._0_4_ = fVar164;
                fVar163 = auVar95._8_4_ * fVar163;
                auVar63._8_4_ = fVar163;
                fVar173 = auVar95._12_4_ * fVar173;
                auVar63._12_4_ = fVar173;
                fVar129 = auVar95._16_4_ * 0.0;
                auVar63._16_4_ = fVar129;
                fVar130 = auVar95._20_4_ * 0.0;
                auVar63._20_4_ = fVar130;
                fVar131 = auVar95._24_4_ * 0.0;
                auVar63._24_4_ = fVar131;
                auVar63._28_4_ = auVar95._28_4_;
                auVar182._8_4_ = 0x3f800000;
                auVar182._0_8_ = &DAT_3f8000003f800000;
                auVar182._12_4_ = 0x3f800000;
                auVar182._16_4_ = 0x3f800000;
                auVar182._20_4_ = 0x3f800000;
                auVar182._24_4_ = 0x3f800000;
                auVar182._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar182,auVar62);
                local_880._0_4_ =
                     (uint)(bVar72 & 1) * (int)fVar174 | (uint)!(bool)(bVar72 & 1) * auVar106._0_4_;
                bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                local_880._4_4_ = (uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar106._4_4_;
                bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                local_880._8_4_ = (uint)bVar12 * (int)fVar158 | (uint)!bVar12 * auVar106._8_4_;
                bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                local_880._12_4_ = (uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar106._12_4_;
                bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                local_880._16_4_ = (uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar106._16_4_;
                bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                local_880._20_4_ = (uint)bVar12 * (int)fVar81 | (uint)!bVar12 * auVar106._20_4_;
                bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                local_880._24_4_ = (uint)bVar12 * (int)fVar128 | (uint)!bVar12 * auVar106._24_4_;
                bVar12 = SUB81(uVar70 >> 7,0);
                local_880._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar106._28_4_;
                auVar106 = vsubps_avx(auVar182,auVar63);
                local_560._0_4_ =
                     (uint)(bVar72 & 1) * (int)fVar164 | (uint)!(bool)(bVar72 & 1) * auVar106._0_4_;
                bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                local_560._4_4_ = (uint)bVar12 * (int)fVar148 | (uint)!bVar12 * auVar106._4_4_;
                bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                local_560._8_4_ = (uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar106._8_4_;
                bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                local_560._12_4_ = (uint)bVar12 * (int)fVar173 | (uint)!bVar12 * auVar106._12_4_;
                bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                local_560._16_4_ = (uint)bVar12 * (int)fVar129 | (uint)!bVar12 * auVar106._16_4_;
                bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                local_560._20_4_ = (uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar106._20_4_;
                bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                local_560._24_4_ = (uint)bVar12 * (int)fVar131 | (uint)!bVar12 * auVar106._24_4_;
                bVar12 = SUB81(uVar70 >> 7,0);
                local_560._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar106._28_4_;
                local_8a0 = auVar108;
              }
            }
            auVar210 = ZEXT3264(local_920);
            auVar197 = ZEXT3264(local_900);
            if (local_630 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar85),auVar97);
              auVar86 = vfmadd213ps_fma(auVar106,local_880,auVar97);
              uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar37._4_4_ = uVar135;
              auVar37._0_4_ = uVar135;
              auVar37._8_4_ = uVar135;
              auVar37._12_4_ = uVar135;
              auVar37._16_4_ = uVar135;
              auVar37._20_4_ = uVar135;
              auVar37._24_4_ = uVar135;
              auVar37._28_4_ = uVar135;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                            CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                     CONCAT44(auVar86._4_4_ +
                                                                              auVar86._4_4_,
                                                                              auVar86._0_4_ +
                                                                              auVar86._0_4_)))),
                                         auVar37);
              uVar136 = vcmpps_avx512vl(local_8a0,auVar106,6);
              local_630 = local_630 & (byte)uVar136;
              if (local_630 != 0) {
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_6c0 = vfmadd132ps_avx512vl(local_560,auVar146,auVar38);
                local_560 = local_6c0;
                auVar106 = local_560;
                local_680 = (undefined4)lVar78;
                local_670 = local_970._0_8_;
                uStack_668 = local_970._8_8_;
                local_660 = local_750._0_8_;
                uStack_658 = local_750._8_8_;
                local_650 = local_760._0_8_;
                uStack_648 = local_760._8_8_;
                local_640 = local_770._0_8_;
                uStack_638 = local_770._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar77].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar72 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar72 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = vmovdqa64_avx512vl(auVar201._0_32_);
                  auVar86 = vcvtsi2ss_avx512f(auVar202._0_16_,local_680);
                  fVar164 = auVar86._0_4_;
                  local_620[0] = (fVar164 + local_880._0_4_ + 0.0) * (float)local_720;
                  local_620[1] = (fVar164 + local_880._4_4_ + 1.0) * local_720._4_4_;
                  local_620[2] = (fVar164 + local_880._8_4_ + 2.0) * fStack_718;
                  local_620[3] = (fVar164 + local_880._12_4_ + 3.0) * fStack_714;
                  fStack_610 = (fVar164 + local_880._16_4_ + 4.0) * fStack_710;
                  fStack_60c = (fVar164 + local_880._20_4_ + 5.0) * fStack_70c;
                  fStack_608 = (fVar164 + local_880._24_4_ + 6.0) * fStack_708;
                  fStack_604 = fVar164 + local_880._28_4_ + 7.0;
                  local_560._0_8_ = local_6c0._0_8_;
                  local_560._8_8_ = local_6c0._8_8_;
                  local_560._16_8_ = local_6c0._16_8_;
                  local_560._24_8_ = local_6c0._24_8_;
                  local_600 = local_560._0_8_;
                  uStack_5f8 = local_560._8_8_;
                  uStack_5f0 = local_560._16_8_;
                  uStack_5e8 = local_560._24_8_;
                  local_5e0 = local_8a0;
                  local_8c0 = local_750._0_8_;
                  uStack_8b8 = local_750._8_8_;
                  uVar70 = 0;
                  uVar73 = (ulong)local_630;
                  for (uVar75 = uVar73; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000
                      ) {
                    uVar70 = uVar70 + 1;
                  }
                  local_8d0 = local_760._0_4_;
                  fStack_8cc = local_760._4_4_;
                  fStack_8c8 = local_760._8_4_;
                  fStack_8c4 = local_760._12_4_;
                  _local_990 = local_770;
                  local_500._0_4_ = 1;
                  local_6e0 = local_880;
                  local_6a0 = local_8a0;
                  local_67c = iVar7;
                  local_560 = auVar106;
                  do {
                    local_980 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar70]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_600 + uVar70 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar70 * 4);
                    local_9c0.context = context->user;
                    fVar173 = local_200._0_4_;
                    fVar164 = 1.0 - fVar173;
                    auVar31._8_4_ = 0x80000000;
                    auVar31._0_8_ = 0x8000000080000000;
                    auVar31._12_4_ = 0x80000000;
                    auVar87 = vxorps_avx512vl(ZEXT416((uint)fVar164),auVar31);
                    auVar86 = ZEXT416((uint)(fVar173 * fVar164 * 4.0));
                    auVar85 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar86);
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar86)
                    ;
                    fVar164 = fVar164 * auVar87._0_4_ * 0.5;
                    fVar148 = auVar85._0_4_ * 0.5;
                    fVar163 = auVar86._0_4_ * 0.5;
                    fVar173 = fVar173 * fVar173 * 0.5;
                    auVar180._0_4_ = fVar173 * (float)local_990._0_4_;
                    auVar180._4_4_ = fVar173 * (float)local_990._4_4_;
                    auVar180._8_4_ = fVar173 * fStack_988;
                    auVar180._12_4_ = fVar173 * fStack_984;
                    auVar143._4_4_ = fVar163;
                    auVar143._0_4_ = fVar163;
                    auVar143._8_4_ = fVar163;
                    auVar143._12_4_ = fVar163;
                    auVar65._4_4_ = fStack_8cc;
                    auVar65._0_4_ = local_8d0;
                    auVar65._8_4_ = fStack_8c8;
                    auVar65._12_4_ = fStack_8c4;
                    auVar86 = vfmadd132ps_fma(auVar143,auVar180,auVar65);
                    auVar168._4_4_ = fVar148;
                    auVar168._0_4_ = fVar148;
                    auVar168._8_4_ = fVar148;
                    auVar168._12_4_ = fVar148;
                    auVar67._8_8_ = uStack_8b8;
                    auVar67._0_8_ = local_8c0;
                    auVar86 = vfmadd132ps_fma(auVar168,auVar86,auVar67);
                    auVar144._4_4_ = fVar164;
                    auVar144._0_4_ = fVar164;
                    auVar144._8_4_ = fVar164;
                    auVar144._12_4_ = fVar164;
                    auVar86 = vfmadd132ps_fma(auVar144,auVar86,local_970);
                    auVar147 = vbroadcastss_avx512f(auVar86);
                    auVar209 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar209,ZEXT1664(auVar86));
                    auVar209 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar209,ZEXT1664(auVar86));
                    local_2c0[0] = (RTCHitN)auVar147[0];
                    local_2c0[1] = (RTCHitN)auVar147[1];
                    local_2c0[2] = (RTCHitN)auVar147[2];
                    local_2c0[3] = (RTCHitN)auVar147[3];
                    local_2c0[4] = (RTCHitN)auVar147[4];
                    local_2c0[5] = (RTCHitN)auVar147[5];
                    local_2c0[6] = (RTCHitN)auVar147[6];
                    local_2c0[7] = (RTCHitN)auVar147[7];
                    local_2c0[8] = (RTCHitN)auVar147[8];
                    local_2c0[9] = (RTCHitN)auVar147[9];
                    local_2c0[10] = (RTCHitN)auVar147[10];
                    local_2c0[0xb] = (RTCHitN)auVar147[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar147[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar147[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar147[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar147[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar147[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar147[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar147[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar147[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar147[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar147[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar147[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar147[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar147[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar147[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar147[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar147[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar147[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar147[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar147[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar147[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar147[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar147[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar147[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar147[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar147[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar147[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar147[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar147[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar147[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar147[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar147[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar147[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar147[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar147[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar147[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar147[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar147[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar147[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar147[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar147[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar147[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar147[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar147[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar147[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar147[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar147[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar147[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar147[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar147[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar147[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar147[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar147[0x3f];
                    local_180 = local_440._0_8_;
                    uStack_178 = local_440._8_8_;
                    uStack_170 = local_440._16_8_;
                    uStack_168 = local_440._24_8_;
                    uStack_160 = local_440._32_8_;
                    uStack_158 = local_440._40_8_;
                    uStack_150 = local_440._48_8_;
                    uStack_148 = local_440._56_8_;
                    auVar147 = vmovdqa64_avx512f(local_480);
                    local_140 = vmovdqa64_avx512f(auVar147);
                    vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_9c0.context)->instPrimID[0]));
                    local_5c0 = local_300;
                    local_9c0.valid = (int *)local_5c0;
                    local_9c0.geometryUserPtr = pGVar8->userPtr;
                    local_9c0.hit = local_2c0;
                    local_9c0.N = 0x10;
                    pRVar71 = (RayK<16> *)pGVar8->occlusionFilterN;
                    local_4c0._0_8_ = uVar70;
                    uVar75 = uVar70;
                    local_9c0.ray = (RTCRayN *)ray;
                    if (pRVar71 != (RayK<16> *)0x0) {
                      pRVar71 = (RayK<16> *)(*(code *)pRVar71)(&local_9c0);
                      uVar75 = local_4c0._0_8_;
                    }
                    auVar147 = vmovdqa64_avx512f(local_5c0);
                    uVar136 = vptestmd_avx512f(auVar147,auVar147);
                    if ((short)uVar136 != 0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_9c0);
                        uVar75 = local_4c0._0_8_;
                      }
                      auVar86 = auVar207._0_16_;
                      auVar147 = vmovdqa64_avx512f(local_5c0);
                      uVar70 = vptestmd_avx512f(auVar147,auVar147);
                      auVar147 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar70 & 1);
                      auVar209._0_4_ =
                           (uint)bVar12 * auVar147._0_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x200);
                      bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar209._4_4_ =
                           (uint)bVar12 * auVar147._4_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x204);
                      bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar209._8_4_ =
                           (uint)bVar12 * auVar147._8_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x208);
                      bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar209._12_4_ =
                           (uint)bVar12 * auVar147._12_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x20c);
                      bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar209._16_4_ =
                           (uint)bVar12 * auVar147._16_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x210);
                      bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar209._20_4_ =
                           (uint)bVar12 * auVar147._20_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x214);
                      bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar209._24_4_ =
                           (uint)bVar12 * auVar147._24_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x218);
                      bVar12 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar209._28_4_ =
                           (uint)bVar12 * auVar147._28_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x21c);
                      bVar12 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar209._32_4_ =
                           (uint)bVar12 * auVar147._32_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x220);
                      bVar12 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar209._36_4_ =
                           (uint)bVar12 * auVar147._36_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x224);
                      bVar12 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar209._40_4_ =
                           (uint)bVar12 * auVar147._40_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x228);
                      bVar12 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar209._44_4_ =
                           (uint)bVar12 * auVar147._44_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x22c);
                      bVar12 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar209._48_4_ =
                           (uint)bVar12 * auVar147._48_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x230);
                      bVar12 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar209._52_4_ =
                           (uint)bVar12 * auVar147._52_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x234);
                      bVar12 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar209._56_4_ =
                           (uint)bVar12 * auVar147._56_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x238);
                      bVar12 = SUB81(uVar70 >> 0xf,0);
                      auVar209._60_4_ =
                           (uint)bVar12 * auVar147._60_4_ |
                           (uint)!bVar12 * *(int *)(local_9c0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9c0.ray + 0x200) = auVar209;
                      pRVar71 = (RayK<16> *)local_9c0.ray;
                      if ((short)uVar70 != 0) break;
                    }
                    auVar86 = auVar207._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_980;
                    uVar70 = 0;
                    uVar73 = uVar73 ^ 1L << (uVar75 & 0x3f);
                    for (uVar75 = uVar73; (uVar75 & 1) == 0;
                        uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                      uVar70 = uVar70 + 1;
                    }
                    local_500._0_4_ = (int)CONCAT71((int7)((ulong)pRVar71 >> 8),uVar73 != 0);
                  } while (uVar73 != 0);
                  bVar72 = local_500[0] & 1;
                  auVar86 = vxorps_avx512vl(auVar86,auVar86);
                  auVar207 = ZEXT1664(auVar86);
                  auVar203 = ZEXT3264(local_7a0);
                  auVar204 = ZEXT3264(local_740);
                  auVar205 = ZEXT3264(local_7c0);
                  auVar197 = ZEXT3264(local_900);
                  auVar210 = ZEXT3264(local_920);
                  auVar208 = ZEXT3264(local_800);
                  auVar147 = ZEXT3264(local_820);
                  auVar209 = ZEXT3264(local_840);
                  auVar106 = vmovdqa64_avx512vl(local_400);
                  auVar201 = ZEXT3264(auVar106);
                }
                bVar76 = (bool)(bVar76 | bVar72);
              }
            }
          }
          lVar78 = lVar78 + 8;
          auVar202 = auVar197;
        } while ((int)lVar78 < iVar7);
      }
      if (bVar76 != false) {
        return local_9f9;
      }
      uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar135;
      auVar30._0_4_ = uVar135;
      auVar30._8_4_ = uVar135;
      auVar30._12_4_ = uVar135;
      uVar136 = vcmpps_avx512vl(local_510,auVar30,2);
      uVar77 = (uint)uVar79 & (uint)uVar79 + 0xf & (uint)uVar136;
      uVar79 = (ulong)uVar77;
      local_9f9 = uVar77 != 0;
    } while (local_9f9);
  }
  return local_9f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }